

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderIndexingTests.cpp
# Opt level: O3

int __thiscall
vkt::sr::anon_unknown_0::ShaderIndexingTests::init(ShaderIndexingTests *this,EVP_PKEY_CTX *ctx)

{
  DataType DVar1;
  TestContext *pTVar2;
  uint uVar3;
  int iVar4;
  DataType dataType;
  int extraout_EAX;
  TestNode *pTVar5;
  char *pcVar6;
  long *plVar7;
  TestNode *pTVar8;
  ostream *poVar9;
  size_t sVar10;
  char *pcVar11;
  long *plVar12;
  size_type *psVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  bool bVar17;
  long lVar18;
  long lVar19;
  ShaderEvalFunc p_Var20;
  ostringstream *poVar21;
  bool bVar22;
  StringTemplate vertTemplate;
  _Alloc_hider local_4c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_4b8;
  StringTemplate fragTemplate;
  string vertexShaderSource;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  params;
  allocator<char> local_412;
  allocator<char> local_411;
  string desc;
  string name;
  string local_3b0;
  TestContext *local_390;
  long local_388;
  char *local_380;
  char *local_378;
  ulong local_370;
  ostringstream vtx;
  long local_358;
  long lStack_350;
  ios_base local_2f8 [264];
  string local_1f0;
  string local_1d0;
  ostringstream frag;
  long local_1a0;
  long lStack_198;
  ios_base local_140 [264];
  long local_38;
  
  pTVar5 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar5,(this->super_TestCaseGroup).super_TestNode.m_testCtx,
             "varying_array","Varying array access tests.");
  lVar15 = 0;
  do {
    DVar1 = sr::(anonymous_namespace)::ShaderOperatorTests::init()::s_floatTypes[lVar15];
    lVar14 = 0;
    do {
      local_390 = (TestContext *)0x23;
      if (lVar14 == 2) {
        local_390 = (TestContext *)0x1d;
      }
      pcVar11 = "\tfor (int i = 0; i < ui_four; i++)\n";
      if (lVar14 == 2) {
        pcVar11 = "\tfor (int i = 0; i < 4; i++)\n";
      }
      lVar18 = 0;
      do {
        pcVar6 = glu::getDataTypeName(DVar1);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&fragTemplate,pcVar6,(allocator<char> *)&vertexShaderSource);
        plVar7 = (long *)std::__cxx11::string::append((char *)&fragTemplate);
        params._M_t._M_impl._0_8_ = &params._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
        plVar12 = plVar7 + 2;
        if ((long *)*plVar7 == plVar12) {
          params._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)*plVar12;
          params._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)plVar7[3];
        }
        else {
          params._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)*plVar12;
          params._M_t._M_impl._0_8_ = (long *)*plVar7;
        }
        params._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ = plVar7[1];
        *plVar7 = (long)plVar12;
        plVar7[1] = 0;
        *(undefined1 *)(plVar7 + 2) = 0;
        plVar7 = (long *)std::__cxx11::string::append((char *)&params);
        vertTemplate.m_template._M_dataplus._M_p = (pointer)&vertTemplate.m_template.field_2;
        psVar13 = (size_type *)(plVar7 + 2);
        if ((size_type *)*plVar7 == psVar13) {
          vertTemplate.m_template.field_2._M_allocated_capacity = *psVar13;
          vertTemplate.m_template.field_2._8_8_ = plVar7[3];
        }
        else {
          vertTemplate.m_template.field_2._M_allocated_capacity = *psVar13;
          vertTemplate.m_template._M_dataplus._M_p = (pointer)*plVar7;
        }
        vertTemplate.m_template._M_string_length = plVar7[1];
        *plVar7 = (long)psVar13;
        plVar7[1] = 0;
        *(undefined1 *)(plVar7 + 2) = 0;
        plVar7 = (long *)std::__cxx11::string::append((char *)&vertTemplate);
        _frag = &local_1a0;
        plVar12 = plVar7 + 2;
        if ((long *)*plVar7 == plVar12) {
          local_1a0 = *plVar12;
          lStack_198 = plVar7[3];
        }
        else {
          local_1a0 = *plVar12;
          _frag = (long *)*plVar7;
        }
        *plVar7 = (long)plVar12;
        plVar7[1] = 0;
        *(undefined1 *)(plVar7 + 2) = 0;
        plVar7 = (long *)std::__cxx11::string::append((char *)&frag);
        _vtx = &local_358;
        plVar12 = plVar7 + 2;
        if ((long *)*plVar7 == plVar12) {
          local_358 = *plVar12;
          lStack_350 = plVar7[3];
        }
        else {
          local_358 = *plVar12;
          _vtx = (long *)*plVar7;
        }
        *plVar7 = (long)plVar12;
        plVar7[1] = 0;
        *(undefined1 *)(plVar7 + 2) = 0;
        plVar7 = (long *)std::__cxx11::string::append((char *)&vtx);
        name._M_dataplus._M_p = (pointer)&name.field_2;
        psVar13 = (size_type *)(plVar7 + 2);
        if ((size_type *)*plVar7 == psVar13) {
          name.field_2._M_allocated_capacity = *psVar13;
          name.field_2._8_8_ = plVar7[3];
        }
        else {
          name.field_2._M_allocated_capacity = *psVar13;
          name._M_dataplus._M_p = (pointer)*plVar7;
        }
        name._M_string_length = plVar7[1];
        *plVar7 = (long)psVar13;
        plVar7[1] = 0;
        *(undefined1 *)(plVar7 + 2) = 0;
        if (_vtx != &local_358) {
          operator_delete(_vtx,local_358 + 1);
        }
        if (_frag != &local_1a0) {
          operator_delete(_frag,local_1a0 + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)vertTemplate.m_template._M_dataplus._M_p != &vertTemplate.m_template.field_2) {
          operator_delete(vertTemplate.m_template._M_dataplus._M_p,
                          vertTemplate.m_template.field_2._M_allocated_capacity + 1);
        }
        if ((_Base_ptr *)params._M_t._M_impl._0_8_ !=
            &params._M_t._M_impl.super__Rb_tree_header._M_header._M_parent) {
          operator_delete((void *)params._M_t._M_impl._0_8_,
                          (ulong)((long)&(params._M_t._M_impl.super__Rb_tree_header._M_header.
                                         _M_parent)->_M_color + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)fragTemplate.m_template._M_dataplus._M_p != &fragTemplate.m_template.field_2) {
          operator_delete(fragTemplate.m_template._M_dataplus._M_p,
                          fragTemplate.m_template.field_2._M_allocated_capacity + 1);
        }
        params._M_t._M_impl._0_8_ = &params._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
        std::__cxx11::string::_M_construct<char_const*>((string *)&params,"Varying array with ","");
        plVar7 = (long *)std::__cxx11::string::append((char *)&params);
        vertTemplate.m_template._M_dataplus._M_p = (pointer)&vertTemplate.m_template.field_2;
        psVar13 = (size_type *)(plVar7 + 2);
        if ((size_type *)*plVar7 == psVar13) {
          vertTemplate.m_template.field_2._M_allocated_capacity = *psVar13;
          vertTemplate.m_template.field_2._8_8_ = plVar7[3];
        }
        else {
          vertTemplate.m_template.field_2._M_allocated_capacity = *psVar13;
          vertTemplate.m_template._M_dataplus._M_p = (pointer)*plVar7;
        }
        vertTemplate.m_template._M_string_length = plVar7[1];
        *plVar7 = (long)psVar13;
        plVar7[1] = 0;
        *(undefined1 *)(plVar7 + 2) = 0;
        plVar7 = (long *)std::__cxx11::string::append((char *)&vertTemplate);
        _frag = &local_1a0;
        plVar12 = plVar7 + 2;
        if ((long *)*plVar7 == plVar12) {
          local_1a0 = *plVar12;
          lStack_198 = plVar7[3];
        }
        else {
          local_1a0 = *plVar12;
          _frag = (long *)*plVar7;
        }
        *plVar7 = (long)plVar12;
        plVar7[1] = 0;
        *(undefined1 *)(plVar7 + 2) = 0;
        plVar7 = (long *)std::__cxx11::string::append((char *)&frag);
        _vtx = &local_358;
        plVar12 = plVar7 + 2;
        if ((long *)*plVar7 == plVar12) {
          local_358 = *plVar12;
          lStack_350 = plVar7[3];
        }
        else {
          local_358 = *plVar12;
          _vtx = (long *)*plVar7;
        }
        *plVar7 = (long)plVar12;
        plVar7[1] = 0;
        *(undefined1 *)(plVar7 + 2) = 0;
        plVar7 = (long *)std::__cxx11::string::append((char *)&vtx);
        desc._M_dataplus._M_p = (pointer)&desc.field_2;
        psVar13 = (size_type *)(plVar7 + 2);
        if ((size_type *)*plVar7 == psVar13) {
          desc.field_2._M_allocated_capacity = *psVar13;
          desc.field_2._8_8_ = plVar7[3];
        }
        else {
          desc.field_2._M_allocated_capacity = *psVar13;
          desc._M_dataplus._M_p = (pointer)*plVar7;
        }
        desc._M_string_length = plVar7[1];
        *plVar7 = (long)psVar13;
        plVar7[1] = 0;
        *(undefined1 *)(plVar7 + 2) = 0;
        if (_vtx != &local_358) {
          operator_delete(_vtx,local_358 + 1);
        }
        if (_frag != &local_1a0) {
          operator_delete(_frag,local_1a0 + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)vertTemplate.m_template._M_dataplus._M_p != &vertTemplate.m_template.field_2) {
          operator_delete(vertTemplate.m_template._M_dataplus._M_p,
                          vertTemplate.m_template.field_2._M_allocated_capacity + 1);
        }
        if ((_Base_ptr *)params._M_t._M_impl._0_8_ !=
            &params._M_t._M_impl.super__Rb_tree_header._M_header._M_parent) {
          operator_delete((void *)params._M_t._M_impl._0_8_,
                          (ulong)((long)&(params._M_t._M_impl.super__Rb_tree_header._M_header.
                                         _M_parent)->_M_color + 1));
        }
        pTVar2 = (this->super_TestCaseGroup).super_TestNode.m_testCtx;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&vtx);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&vtx,"#version 310 es\n",0x10)
        ;
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&vtx,"layout(location = 0) in highp vec4 a_position;\n",0x2f);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&vtx,"layout(location = 1) in highp vec4 a_coords;\n",0x2d);
        if (lVar14 == 1) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&vtx,
                     "layout(std140, binding = 0) uniform something0 { mediump int ui_zero; };\n",
                     0x49);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&vtx,
                     "layout(std140, binding = 1) uniform something1 { mediump int ui_one; };\n",
                     0x48);
          lVar19 = 0x4a;
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&vtx,
                     "layout(std140, binding = 2) uniform something2 { mediump int ui_two; };\n",
                     0x48);
          pcVar6 = "layout(std140, binding = 3) uniform something3 { mediump int ui_three; };\n";
LAB_0057294f:
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&vtx,pcVar6,lVar19);
        }
        else {
          lVar19 = 0x48;
          pcVar6 = "layout(std140, binding = 4) uniform something { mediump int ui_four; };\n";
          if (lVar14 == 3) goto LAB_0057294f;
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&vtx,
                   "layout(location = 0) out ${PRECISION} ${VAR_TYPE} var[${ARRAY_LEN}];\n",0x45);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&vtx,"\n",1);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&vtx,"void main()\n",0xc);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&vtx,"{\n",2);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&vtx,"\tgl_Position = a_position;\n",0x1b);
        if (lVar14 == 0) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&vtx,"\tvar[0] = ${VAR_TYPE}(a_coords);\n",0x21);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&vtx,"\tvar[1] = ${VAR_TYPE}(a_coords) * 0.5;\n",0x27);
          lVar19 = 0x29;
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&vtx,"\tvar[2] = ${VAR_TYPE}(a_coords) * 0.25;\n",0x28);
          pcVar6 = "\tvar[3] = ${VAR_TYPE}(a_coords) * 0.125;\n";
        }
        else if (lVar14 == 1) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&vtx,"\tvar[ui_zero]  = ${VAR_TYPE}(a_coords);\n",0x28);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&vtx,"\tvar[ui_one]   = ${VAR_TYPE}(a_coords) * 0.5;\n",0x2e);
          lVar19 = 0x30;
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&vtx,"\tvar[ui_two]   = ${VAR_TYPE}(a_coords) * 0.25;\n",0x2f);
          pcVar6 = "\tvar[ui_three] = ${VAR_TYPE}(a_coords) * 0.125;\n";
        }
        else {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&vtx,"\t${PRECISION} ${VAR_TYPE} coords = ${VAR_TYPE}(a_coords);\n",
                     0x3a);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&vtx,pcVar11,(long)local_390);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&vtx,"\t{\n",3);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&vtx,"\t\tvar[i] = ${VAR_TYPE}(coords);\n",0x20);
          lVar19 = 3;
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&vtx,"\t\tcoords = coords * 0.5;\n",0x19);
          pcVar6 = "\t}\n";
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&vtx,pcVar6,lVar19);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&vtx,"}\n",2);
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&frag);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&frag,"#version 310 es\n",0x10);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&frag,"precision mediump int;\n",0x17);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&frag,"layout(location = 0) out mediump vec4 o_color;\n",0x2f);
        if (lVar18 == 8) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&frag,
                     "layout(std140, binding = 0) uniform something0 { mediump int ui_zero; };\n",
                     0x49);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&frag,
                     "layout(std140, binding = 1) uniform something1 { mediump int ui_one; };\n",
                     0x48);
          lVar19 = 0x4a;
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&frag,
                     "layout(std140, binding = 2) uniform something2 { mediump int ui_two; };\n",
                     0x48);
          pcVar6 = "layout(std140, binding = 3) uniform something3 { mediump int ui_three; };\n";
LAB_00572bda:
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&frag,pcVar6,lVar19);
        }
        else {
          lVar19 = 0x49;
          pcVar6 = "layout(std140, binding = 4) uniform something4 { mediump int ui_four; };\n";
          if (lVar18 == 0x18) goto LAB_00572bda;
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&frag,
                   "layout(location = 0) in ${PRECISION} ${VAR_TYPE} var[${ARRAY_LEN}];\n",0x44);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&frag,"\n",1);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&frag,"void main()\n",0xc);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&frag,"{\n",2);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&frag,"\t${PRECISION} ${VAR_TYPE} res = ${VAR_TYPE}(0.0);\n",0x32);
        if (lVar18 == 0) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&frag,"\tres += var[0];\n",0x10);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&frag,"\tres += var[1];\n",0x10);
          lVar19 = 0x10;
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&frag,"\tres += var[2];\n",0x10);
          pcVar6 = "\tres += var[3];\n";
        }
        else if (lVar18 == 8) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&frag,"\tres += var[ui_zero];\n",0x16);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&frag,"\tres += var[ui_one];\n",0x15);
          lVar19 = 0x17;
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&frag,"\tres += var[ui_two];\n",0x15);
          pcVar6 = "\tres += var[ui_three];\n";
        }
        else {
          pcVar6 = "\tfor (int i = 0; i < ui_four; i++)\n";
          if (lVar18 == 0x10) {
            pcVar6 = "\tfor (int i = 0; i < 4; i++)\n";
          }
          lVar16 = 0x23;
          if (lVar18 == 0x10) {
            lVar16 = 0x1d;
          }
          lVar19 = 0x11;
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&frag,pcVar6,lVar16);
          pcVar6 = "\t\tres += var[i];\n";
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&frag,pcVar6,lVar19);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&frag,"\to_color = vec4(res${PADDING});\n",0x20);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&frag,"}\n",2);
        params._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
             params._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ & 0xffffffff00000000;
        params._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
        params._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
             &params._M_t._M_impl.super__Rb_tree_header._M_header;
        params._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
        params._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
             params._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        fragTemplate.m_template._M_dataplus._M_p = glu::getDataTypeName(DVar1);
        std::
        pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::pair<const_char_(&)[9],_const_char_*,_true>
                  ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&vertTemplate,(char (*) [9])0xaef266,(char **)&fragTemplate);
        std::
        _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
        ::_M_emplace_unique<std::pair<std::__cxx11::string,std::__cxx11::string>>
                  ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                    *)&params,
                   (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&vertTemplate);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_4c8._M_p != &local_4b8) {
          operator_delete(local_4c8._M_p,local_4b8._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)vertTemplate.m_template._M_dataplus._M_p != &vertTemplate.m_template.field_2) {
          operator_delete(vertTemplate.m_template._M_dataplus._M_p,
                          vertTemplate.m_template.field_2._M_allocated_capacity + 1);
        }
        std::
        pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::pair<const_char_(&)[10],_const_char_(&)[2],_true>
                  ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&vertTemplate,(char (*) [10])"ARRAY_LEN",(char (*) [2])0xaf4684);
        std::
        _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
        ::_M_emplace_unique<std::pair<std::__cxx11::string,std::__cxx11::string>>
                  ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                    *)&params,
                   (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&vertTemplate);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_4c8._M_p != &local_4b8) {
          operator_delete(local_4c8._M_p,local_4b8._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)vertTemplate.m_template._M_dataplus._M_p != &vertTemplate.m_template.field_2) {
          operator_delete(vertTemplate.m_template._M_dataplus._M_p,
                          vertTemplate.m_template.field_2._M_allocated_capacity + 1);
        }
        std::
        pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::pair<const_char_(&)[10],_const_char_(&)[8],_true>
                  ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&vertTemplate,(char (*) [10])0xaef277,(char (*) [8])0xb2c06a);
        std::
        _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
        ::_M_emplace_unique<std::pair<std::__cxx11::string,std::__cxx11::string>>
                  ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                    *)&params,
                   (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&vertTemplate);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_4c8._M_p != &local_4b8) {
          operator_delete(local_4c8._M_p,local_4b8._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)vertTemplate.m_template._M_dataplus._M_p != &vertTemplate.m_template.field_2) {
          operator_delete(vertTemplate.m_template._M_dataplus._M_p,
                          vertTemplate.m_template.field_2._M_allocated_capacity + 1);
        }
        if (DVar1 == TYPE_FLOAT_VEC3) {
          std::
          pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::pair<const_char_(&)[8],_const_char_(&)[6],_true>
                    ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&vertTemplate,(char (*) [8])"PADDING",(char (*) [6])0xaf8ed4);
          std::
          _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
          ::_M_emplace_unique<std::pair<std::__cxx11::string,std::__cxx11::string>>
                    ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                      *)&params,
                     (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&vertTemplate);
        }
        else if (DVar1 == TYPE_FLOAT_VEC2) {
          std::
          pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::pair<const_char_(&)[8],_const_char_(&)[11],_true>
                    ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&vertTemplate,(char (*) [8])"PADDING",(char (*) [11])0xaf8ecf);
          std::
          _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
          ::_M_emplace_unique<std::pair<std::__cxx11::string,std::__cxx11::string>>
                    ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                      *)&params,
                     (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&vertTemplate);
        }
        else if (DVar1 == TYPE_FLOAT) {
          std::
          pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::pair<const_char_(&)[8],_const_char_(&)[16],_true>
                    ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&vertTemplate,(char (*) [8])"PADDING",(char (*) [16])0xaf8f20);
          std::
          _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
          ::_M_emplace_unique<std::pair<std::__cxx11::string,std::__cxx11::string>>
                    ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                      *)&params,
                     (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&vertTemplate);
        }
        else {
          std::
          pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::pair<const_char_(&)[8],_const_char_(&)[1],_true>
                    ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&vertTemplate,(char (*) [8])"PADDING",(char (*) [1])0xa99b87);
          std::
          _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
          ::_M_emplace_unique<std::pair<std::__cxx11::string,std::__cxx11::string>>
                    ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                      *)&params,
                     (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&vertTemplate);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_4c8._M_p != &local_4b8) {
          operator_delete(local_4c8._M_p,local_4b8._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)vertTemplate.m_template._M_dataplus._M_p != &vertTemplate.m_template.field_2) {
          operator_delete(vertTemplate.m_template._M_dataplus._M_p,
                          vertTemplate.m_template.field_2._M_allocated_capacity + 1);
        }
        std::__cxx11::stringbuf::str();
        tcu::StringTemplate::StringTemplate(&vertTemplate,&fragTemplate.m_template);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)fragTemplate.m_template._M_dataplus._M_p != &fragTemplate.m_template.field_2) {
          operator_delete(fragTemplate.m_template._M_dataplus._M_p,
                          fragTemplate.m_template.field_2._M_allocated_capacity + 1);
        }
        std::__cxx11::stringbuf::str();
        tcu::StringTemplate::StringTemplate(&fragTemplate,&vertexShaderSource);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)vertexShaderSource._M_dataplus._M_p != &vertexShaderSource.field_2) {
          operator_delete(vertexShaderSource._M_dataplus._M_p,
                          vertexShaderSource.field_2._M_allocated_capacity + 1);
        }
        tcu::StringTemplate::specialize(&vertexShaderSource,&vertTemplate,&params);
        tcu::StringTemplate::specialize(&local_3b0,&fragTemplate,&params);
        if (DVar1 - TYPE_FLOAT < 4) {
          p_Var20 = (ShaderEvalFunc)(&PTR_evalArrayCoordsFloat_00cf6c20)[DVar1 - TYPE_FLOAT];
        }
        else {
          p_Var20 = (ShaderEvalFunc)0x0;
        }
        pTVar8 = (TestNode *)operator_new(0xe0);
        ShaderIndexingCase::ShaderIndexingCase
                  ((ShaderIndexingCase *)pTVar8,pTVar2,&name,&desc,true,p_Var20,&vertexShaderSource,
                   &local_3b0,DVar1,false);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3b0._M_dataplus._M_p != &local_3b0.field_2) {
          operator_delete(local_3b0._M_dataplus._M_p,local_3b0.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)vertexShaderSource._M_dataplus._M_p != &vertexShaderSource.field_2) {
          operator_delete(vertexShaderSource._M_dataplus._M_p,
                          vertexShaderSource.field_2._M_allocated_capacity + 1);
        }
        tcu::StringTemplate::~StringTemplate(&fragTemplate);
        tcu::StringTemplate::~StringTemplate(&vertTemplate);
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::~_Rb_tree(&params._M_t);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&frag);
        std::ios_base::~ios_base(local_140);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&vtx);
        std::ios_base::~ios_base(local_2f8);
        tcu::TestNode::addChild(pTVar5,pTVar8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)desc._M_dataplus._M_p != &desc.field_2) {
          operator_delete(desc._M_dataplus._M_p,desc.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)name._M_dataplus._M_p != &name.field_2) {
          operator_delete(name._M_dataplus._M_p,name.field_2._M_allocated_capacity + 1);
        }
        lVar18 = lVar18 + 8;
      } while (lVar18 != 0x20);
      lVar14 = lVar14 + 1;
    } while (lVar14 != 4);
    lVar15 = lVar15 + 1;
  } while (lVar15 != 4);
  tcu::TestNode::addChild((TestNode *)this,pTVar5);
  pTVar5 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar5,(this->super_TestCaseGroup).super_TestNode.m_testCtx,
             "uniform_array","Uniform array access tests.");
  lVar15 = 0;
  do {
    DVar1 = sr::(anonymous_namespace)::ShaderOperatorTests::init()::s_floatTypes[lVar15];
    lVar14 = 0;
    do {
      local_390 = (TestContext *)0xaede4b;
      if (lVar14 == 2) {
        local_390 = (TestContext *)0xaeddf2;
      }
      lVar18 = 0x23;
      if (lVar14 == 2) {
        lVar18 = 0x1d;
      }
      bVar17 = true;
      lVar19 = 0;
      do {
        glu::getShaderTypeName
                  (tessellation::createCommonEdgeTests(tcu::TestContext&)::primitiveTypes[lVar19]);
        pcVar11 = glu::getDataTypeName(DVar1);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&params,pcVar11,(allocator<char> *)&fragTemplate);
        plVar7 = (long *)std::__cxx11::string::append((char *)&params);
        vertTemplate.m_template._M_dataplus._M_p = (pointer)&vertTemplate.m_template.field_2;
        psVar13 = (size_type *)(plVar7 + 2);
        if ((size_type *)*plVar7 == psVar13) {
          vertTemplate.m_template.field_2._M_allocated_capacity = *psVar13;
          vertTemplate.m_template.field_2._8_8_ = plVar7[3];
        }
        else {
          vertTemplate.m_template.field_2._M_allocated_capacity = *psVar13;
          vertTemplate.m_template._M_dataplus._M_p = (pointer)*plVar7;
        }
        vertTemplate.m_template._M_string_length = plVar7[1];
        *plVar7 = (long)psVar13;
        plVar7[1] = 0;
        *(undefined1 *)(plVar7 + 2) = 0;
        plVar7 = (long *)std::__cxx11::string::append((char *)&vertTemplate);
        _frag = &local_1a0;
        plVar12 = plVar7 + 2;
        if ((long *)*plVar7 == plVar12) {
          local_1a0 = *plVar12;
          lStack_198 = plVar7[3];
        }
        else {
          local_1a0 = *plVar12;
          _frag = (long *)*plVar7;
        }
        *plVar7 = (long)plVar12;
        plVar7[1] = 0;
        *(undefined1 *)(plVar7 + 2) = 0;
        plVar7 = (long *)std::__cxx11::string::append((char *)&frag);
        _vtx = &local_358;
        plVar12 = plVar7 + 2;
        if ((long *)*plVar7 == plVar12) {
          local_358 = *plVar12;
          lStack_350 = plVar7[3];
        }
        else {
          local_358 = *plVar12;
          _vtx = (long *)*plVar7;
        }
        *plVar7 = (long)plVar12;
        plVar7[1] = 0;
        *(undefined1 *)(plVar7 + 2) = 0;
        plVar7 = (long *)std::__cxx11::string::append((char *)&vtx);
        name._M_dataplus._M_p = (pointer)&name.field_2;
        psVar13 = (size_type *)(plVar7 + 2);
        if ((size_type *)*plVar7 == psVar13) {
          name.field_2._M_allocated_capacity = *psVar13;
          name.field_2._8_8_ = plVar7[3];
        }
        else {
          name.field_2._M_allocated_capacity = *psVar13;
          name._M_dataplus._M_p = (pointer)*plVar7;
        }
        name._M_string_length = plVar7[1];
        *plVar7 = (long)psVar13;
        plVar7[1] = 0;
        *(undefined1 *)(plVar7 + 2) = 0;
        if (_vtx != &local_358) {
          operator_delete(_vtx,local_358 + 1);
        }
        if (_frag != &local_1a0) {
          operator_delete(_frag,local_1a0 + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)vertTemplate.m_template._M_dataplus._M_p != &vertTemplate.m_template.field_2) {
          operator_delete(vertTemplate.m_template._M_dataplus._M_p,
                          vertTemplate.m_template.field_2._M_allocated_capacity + 1);
        }
        if ((_Base_ptr *)params._M_t._M_impl._0_8_ !=
            &params._M_t._M_impl.super__Rb_tree_header._M_header._M_parent) {
          operator_delete((void *)params._M_t._M_impl._0_8_,
                          (ulong)((long)&(params._M_t._M_impl.super__Rb_tree_header._M_header.
                                         _M_parent)->_M_color + 1));
        }
        params._M_t._M_impl._0_8_ = &params._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
        std::__cxx11::string::_M_construct<char_const*>((string *)&params,"Uniform array with ","");
        plVar7 = (long *)std::__cxx11::string::append((char *)&params);
        vertTemplate.m_template._M_dataplus._M_p = (pointer)&vertTemplate.m_template.field_2;
        psVar13 = (size_type *)(plVar7 + 2);
        if ((size_type *)*plVar7 == psVar13) {
          vertTemplate.m_template.field_2._M_allocated_capacity = *psVar13;
          vertTemplate.m_template.field_2._8_8_ = plVar7[3];
        }
        else {
          vertTemplate.m_template.field_2._M_allocated_capacity = *psVar13;
          vertTemplate.m_template._M_dataplus._M_p = (pointer)*plVar7;
        }
        vertTemplate.m_template._M_string_length = plVar7[1];
        *plVar7 = (long)psVar13;
        plVar7[1] = 0;
        *(undefined1 *)(plVar7 + 2) = 0;
        plVar7 = (long *)std::__cxx11::string::append((char *)&vertTemplate);
        _frag = &local_1a0;
        plVar12 = plVar7 + 2;
        if ((long *)*plVar7 == plVar12) {
          local_1a0 = *plVar12;
          lStack_198 = plVar7[3];
        }
        else {
          local_1a0 = *plVar12;
          _frag = (long *)*plVar7;
        }
        *plVar7 = (long)plVar12;
        plVar7[1] = 0;
        *(undefined1 *)(plVar7 + 2) = 0;
        plVar7 = (long *)std::__cxx11::string::append((char *)&frag);
        _vtx = &local_358;
        plVar12 = plVar7 + 2;
        if ((long *)*plVar7 == plVar12) {
          local_358 = *plVar12;
          lStack_350 = plVar7[3];
        }
        else {
          local_358 = *plVar12;
          _vtx = (long *)*plVar7;
        }
        *plVar7 = (long)plVar12;
        plVar7[1] = 0;
        *(undefined1 *)(plVar7 + 2) = 0;
        plVar7 = (long *)std::__cxx11::string::append((char *)&vtx);
        desc._M_dataplus._M_p = (pointer)&desc.field_2;
        psVar13 = (size_type *)(plVar7 + 2);
        if ((size_type *)*plVar7 == psVar13) {
          desc.field_2._M_allocated_capacity = *psVar13;
          desc.field_2._8_8_ = plVar7[3];
        }
        else {
          desc.field_2._M_allocated_capacity = *psVar13;
          desc._M_dataplus._M_p = (pointer)*plVar7;
        }
        desc._M_string_length = plVar7[1];
        *plVar7 = (long)psVar13;
        plVar7[1] = 0;
        *(undefined1 *)(plVar7 + 2) = 0;
        if (_vtx != &local_358) {
          operator_delete(_vtx,local_358 + 1);
        }
        if (_frag != &local_1a0) {
          operator_delete(_frag,local_1a0 + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)vertTemplate.m_template._M_dataplus._M_p != &vertTemplate.m_template.field_2) {
          operator_delete(vertTemplate.m_template._M_dataplus._M_p,
                          vertTemplate.m_template.field_2._M_allocated_capacity + 1);
        }
        if ((_Base_ptr *)params._M_t._M_impl._0_8_ !=
            &params._M_t._M_impl.super__Rb_tree_header._M_header._M_parent) {
          operator_delete((void *)params._M_t._M_impl._0_8_,
                          (ulong)((long)&(params._M_t._M_impl.super__Rb_tree_header._M_header.
                                         _M_parent)->_M_color + 1));
        }
        pTVar2 = (this->super_TestCaseGroup).super_TestNode.m_testCtx;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&vtx);
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&frag);
        poVar21 = (ostringstream *)&frag;
        if (bVar17) {
          poVar21 = (ostringstream *)&vtx;
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&vtx,"#version 310 es\n",0x10)
        ;
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&frag,"#version 310 es\n",0x10);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&vtx,"layout(location = 0) in highp vec4 a_position;\n",0x2f);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&vtx,"layout(location = 1) in highp vec4 a_coords;\n",0x2d);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&frag,"layout(location = 0) out mediump vec4 o_color;\n",0x2f);
        if (bVar17 == false) {
          lVar19 = 0x2f;
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&vtx,"layout(location = 0) out mediump vec4 v_coords;\n",0x30);
          pcVar11 = "layout(location = 0) in mediump vec4 v_coords;\n";
        }
        else {
          lVar19 = 0x2e;
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&vtx,"layout(location = 0) out mediump vec4 v_color;\n",0x2f);
          pcVar11 = "layout(location = 0) in mediump vec4 v_color;\n";
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&frag,pcVar11,lVar19);
        if (lVar14 == 1) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)poVar21,
                     "layout(std140, binding = 0) uniform something0 { mediump int ui_zero; };\n",
                     0x49);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)poVar21,
                     "layout(std140, binding = 1) uniform something1 { mediump int ui_one; };\n",
                     0x48);
          lVar19 = 0x4a;
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)poVar21,
                     "layout(std140, binding = 2) uniform something2 { mediump int ui_two; };\n",
                     0x48);
          pcVar11 = "layout(std140, binding = 3) uniform something3 { mediump int ui_three; };\n";
LAB_005738a6:
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar21,pcVar11,lVar19);
        }
        else {
          lVar19 = 0x49;
          pcVar11 = "layout(std140, binding = 4) uniform something4 { mediump int ui_four; };\n";
          if (lVar14 == 3) goto LAB_005738a6;
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar21,
                   "layout(std140, binding = 5) uniform something5 { ${PRECISION} ${VAR_TYPE} u_arr[${ARRAY_LEN}]; };\n"
                   ,0x62);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&vtx,"\n",1);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&vtx,"void main()\n",0xc);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&vtx,"{\n",2);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&vtx,"\tgl_Position = a_position;\n",0x1b);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&frag,"\n",1);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&frag,"void main()\n",0xc);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&frag,"{\n",2);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar21,"\t${PRECISION} ${VAR_TYPE} res = ${VAR_TYPE}(0.0);\n",0x32);
        if (lVar14 == 0) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)poVar21,"\tres += u_arr[0];\n",0x12);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)poVar21,"\tres += u_arr[1];\n",0x12);
          lVar19 = 0x12;
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)poVar21,"\tres += u_arr[2];\n",0x12);
          pcVar11 = "\tres += u_arr[3];\n";
        }
        else if (lVar14 == 1) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)poVar21,"\tres += u_arr[ui_zero];\n",0x18);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)poVar21,"\tres += u_arr[ui_one];\n",0x17);
          lVar19 = 0x19;
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)poVar21,"\tres += u_arr[ui_two];\n",0x17);
          pcVar11 = "\tres += u_arr[ui_three];\n";
        }
        else {
          lVar19 = 0x13;
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)poVar21,(char *)local_390,lVar18);
          pcVar11 = "\t\tres += u_arr[i];\n";
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar21,pcVar11,lVar19);
        if (bVar17 == false) {
          lVar19 = 0x20;
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&vtx,"\tv_coords = a_coords;\n",0x16);
          pcVar11 = "\to_color = vec4(res${PADDING});\n";
        }
        else {
          lVar19 = 0x14;
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&vtx,"\tv_color = vec4(res${PADDING});\n",0x20);
          pcVar11 = "\to_color = v_color;\n";
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&frag,pcVar11,lVar19);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&vtx,"}\n",2);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&frag,"}\n",2);
        params._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
             params._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ & 0xffffffff00000000;
        params._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
        params._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
             &params._M_t._M_impl.super__Rb_tree_header._M_header;
        params._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
        params._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
             params._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        fragTemplate.m_template._M_dataplus._M_p = glu::getDataTypeName(DVar1);
        std::
        pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::pair<const_char_(&)[9],_const_char_*,_true>
                  ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&vertTemplate,(char (*) [9])0xaef266,(char **)&fragTemplate);
        std::
        _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
        ::_M_emplace_unique<std::pair<std::__cxx11::string,std::__cxx11::string>>
                  ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                    *)&params,
                   (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&vertTemplate);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_4c8._M_p != &local_4b8) {
          operator_delete(local_4c8._M_p,local_4b8._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)vertTemplate.m_template._M_dataplus._M_p != &vertTemplate.m_template.field_2) {
          operator_delete(vertTemplate.m_template._M_dataplus._M_p,
                          vertTemplate.m_template.field_2._M_allocated_capacity + 1);
        }
        std::
        pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::pair<const_char_(&)[10],_const_char_(&)[2],_true>
                  ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&vertTemplate,(char (*) [10])"ARRAY_LEN",(char (*) [2])0xaf4684);
        std::
        _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
        ::_M_emplace_unique<std::pair<std::__cxx11::string,std::__cxx11::string>>
                  ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                    *)&params,
                   (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&vertTemplate);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_4c8._M_p != &local_4b8) {
          operator_delete(local_4c8._M_p,local_4b8._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)vertTemplate.m_template._M_dataplus._M_p != &vertTemplate.m_template.field_2) {
          operator_delete(vertTemplate.m_template._M_dataplus._M_p,
                          vertTemplate.m_template.field_2._M_allocated_capacity + 1);
        }
        std::
        pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::pair<const_char_(&)[10],_const_char_(&)[8],_true>
                  ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&vertTemplate,(char (*) [10])0xaef277,(char (*) [8])0xb2c06a);
        std::
        _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
        ::_M_emplace_unique<std::pair<std::__cxx11::string,std::__cxx11::string>>
                  ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                    *)&params,
                   (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&vertTemplate);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_4c8._M_p != &local_4b8) {
          operator_delete(local_4c8._M_p,local_4b8._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)vertTemplate.m_template._M_dataplus._M_p != &vertTemplate.m_template.field_2) {
          operator_delete(vertTemplate.m_template._M_dataplus._M_p,
                          vertTemplate.m_template.field_2._M_allocated_capacity + 1);
        }
        if (DVar1 == TYPE_FLOAT_VEC3) {
          std::
          pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::pair<const_char_(&)[8],_const_char_(&)[6],_true>
                    ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&vertTemplate,(char (*) [8])"PADDING",(char (*) [6])0xaf8ed4);
          std::
          _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
          ::_M_emplace_unique<std::pair<std::__cxx11::string,std::__cxx11::string>>
                    ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                      *)&params,
                     (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&vertTemplate);
        }
        else if (DVar1 == TYPE_FLOAT_VEC2) {
          std::
          pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::pair<const_char_(&)[8],_const_char_(&)[11],_true>
                    ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&vertTemplate,(char (*) [8])"PADDING",(char (*) [11])0xaf8ecf);
          std::
          _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
          ::_M_emplace_unique<std::pair<std::__cxx11::string,std::__cxx11::string>>
                    ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                      *)&params,
                     (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&vertTemplate);
        }
        else if (DVar1 == TYPE_FLOAT) {
          std::
          pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::pair<const_char_(&)[8],_const_char_(&)[16],_true>
                    ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&vertTemplate,(char (*) [8])"PADDING",(char (*) [16])0xaf8f20);
          std::
          _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
          ::_M_emplace_unique<std::pair<std::__cxx11::string,std::__cxx11::string>>
                    ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                      *)&params,
                     (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&vertTemplate);
        }
        else {
          std::
          pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::pair<const_char_(&)[8],_const_char_(&)[1],_true>
                    ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&vertTemplate,(char (*) [8])"PADDING",(char (*) [1])0xa99b87);
          std::
          _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
          ::_M_emplace_unique<std::pair<std::__cxx11::string,std::__cxx11::string>>
                    ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                      *)&params,
                     (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&vertTemplate);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_4c8._M_p != &local_4b8) {
          operator_delete(local_4c8._M_p,local_4b8._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)vertTemplate.m_template._M_dataplus._M_p != &vertTemplate.m_template.field_2) {
          operator_delete(vertTemplate.m_template._M_dataplus._M_p,
                          vertTemplate.m_template.field_2._M_allocated_capacity + 1);
        }
        std::__cxx11::stringbuf::str();
        tcu::StringTemplate::StringTemplate(&vertTemplate,&fragTemplate.m_template);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)fragTemplate.m_template._M_dataplus._M_p != &fragTemplate.m_template.field_2) {
          operator_delete(fragTemplate.m_template._M_dataplus._M_p,
                          fragTemplate.m_template.field_2._M_allocated_capacity + 1);
        }
        std::__cxx11::stringbuf::str();
        tcu::StringTemplate::StringTemplate(&fragTemplate,&vertexShaderSource);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)vertexShaderSource._M_dataplus._M_p != &vertexShaderSource.field_2) {
          operator_delete(vertexShaderSource._M_dataplus._M_p,
                          vertexShaderSource.field_2._M_allocated_capacity + 1);
        }
        tcu::StringTemplate::specialize(&vertexShaderSource,&vertTemplate,&params);
        tcu::StringTemplate::specialize(&local_3b0,&fragTemplate,&params);
        if (DVar1 - TYPE_FLOAT < 4) {
          p_Var20 = (ShaderEvalFunc)(&PTR_evalArrayUniformFloat_00cf6c00)[DVar1 - TYPE_FLOAT];
        }
        else {
          p_Var20 = (ShaderEvalFunc)0x0;
        }
        pTVar8 = (TestNode *)operator_new(0xe0);
        ShaderIndexingCase::ShaderIndexingCase
                  ((ShaderIndexingCase *)pTVar8,pTVar2,&name,&desc,bVar17,p_Var20,
                   &vertexShaderSource,&local_3b0,DVar1,true);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3b0._M_dataplus._M_p != &local_3b0.field_2) {
          operator_delete(local_3b0._M_dataplus._M_p,local_3b0.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)vertexShaderSource._M_dataplus._M_p != &vertexShaderSource.field_2) {
          operator_delete(vertexShaderSource._M_dataplus._M_p,
                          vertexShaderSource.field_2._M_allocated_capacity + 1);
        }
        tcu::StringTemplate::~StringTemplate(&fragTemplate);
        tcu::StringTemplate::~StringTemplate(&vertTemplate);
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::~_Rb_tree(&params._M_t);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&frag);
        std::ios_base::~ios_base(local_140);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&vtx);
        std::ios_base::~ios_base(local_2f8);
        tcu::TestNode::addChild(pTVar5,pTVar8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)desc._M_dataplus._M_p != &desc.field_2) {
          operator_delete(desc._M_dataplus._M_p,desc.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)name._M_dataplus._M_p != &name.field_2) {
          operator_delete(name._M_dataplus._M_p,name.field_2._M_allocated_capacity + 1);
        }
        lVar19 = 1;
        bVar22 = bVar17 != false;
        bVar17 = false;
      } while (bVar22);
      lVar14 = lVar14 + 1;
    } while (lVar14 != 4);
    lVar15 = lVar15 + 1;
    if (lVar15 == 4) {
      tcu::TestNode::addChild((TestNode *)this,pTVar5);
      pTVar5 = (TestNode *)operator_new(0x70);
      tcu::TestCaseGroup::TestCaseGroup
                ((TestCaseGroup *)pTVar5,(this->super_TestCaseGroup).super_TestNode.m_testCtx,
                 "tmp_array","Temporary array access tests.");
      lVar15 = 0;
      do {
        DVar1 = sr::(anonymous_namespace)::ShaderOperatorTests::init()::s_floatTypes[lVar15];
        local_370 = (ulong)(DVar1 - TYPE_FLOAT);
        lVar14 = 0;
        local_38 = lVar15;
        do {
          local_380 = "\tfor (int i = 0; i < ui_four; i++)\n";
          if (lVar14 == 2) {
            local_380 = "\tfor (int i = 0; i < 4; i++)\n";
          }
          local_388 = 0x23;
          if (lVar14 == 2) {
            local_388 = 0x1d;
          }
          lVar15 = 0;
          do {
            local_390 = (TestContext *)CONCAT71(local_390._1_7_,lVar15 == 1 || lVar14 == 1);
            local_378 = "\tfor (int i = 0; i < ui_four; i++)\n";
            if (lVar15 == 2) {
              local_378 = "\tfor (int i = 0; i < 4; i++)\n";
            }
            lVar18 = 0x23;
            if (lVar15 == 2) {
              lVar18 = 0x1d;
            }
            bVar17 = true;
            lVar19 = 0;
            do {
              glu::getShaderTypeName
                        (tessellation::createCommonEdgeTests(tcu::TestContext&)::primitiveTypes
                         [lVar19]);
              pcVar11 = glu::getDataTypeName(DVar1);
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&vertexShaderSource,pcVar11,(allocator<char> *)&local_3b0);
              plVar7 = (long *)std::__cxx11::string::append((char *)&vertexShaderSource);
              fragTemplate.m_template._M_dataplus._M_p = (pointer)&fragTemplate.m_template.field_2;
              psVar13 = (size_type *)(plVar7 + 2);
              if ((size_type *)*plVar7 == psVar13) {
                fragTemplate.m_template.field_2._M_allocated_capacity = *psVar13;
                fragTemplate.m_template.field_2._8_8_ = plVar7[3];
              }
              else {
                fragTemplate.m_template.field_2._M_allocated_capacity = *psVar13;
                fragTemplate.m_template._M_dataplus._M_p = (pointer)*plVar7;
              }
              fragTemplate.m_template._M_string_length = plVar7[1];
              *plVar7 = (long)psVar13;
              plVar7[1] = 0;
              *(undefined1 *)(plVar7 + 2) = 0;
              plVar7 = (long *)std::__cxx11::string::append((char *)&fragTemplate);
              params._M_t._M_impl._0_8_ =
                   &params._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
              plVar12 = plVar7 + 2;
              if ((long *)*plVar7 == plVar12) {
                params._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)*plVar12;
                params._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)plVar7[3];
              }
              else {
                params._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)*plVar12;
                params._M_t._M_impl._0_8_ = (long *)*plVar7;
              }
              params._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ = plVar7[1];
              *plVar7 = (long)plVar12;
              plVar7[1] = 0;
              *(undefined1 *)(plVar7 + 2) = 0;
              plVar7 = (long *)std::__cxx11::string::append((char *)&params);
              vertTemplate.m_template._M_dataplus._M_p = (pointer)&vertTemplate.m_template.field_2;
              psVar13 = (size_type *)(plVar7 + 2);
              if ((size_type *)*plVar7 == psVar13) {
                vertTemplate.m_template.field_2._M_allocated_capacity = *psVar13;
                vertTemplate.m_template.field_2._8_8_ = plVar7[3];
              }
              else {
                vertTemplate.m_template.field_2._M_allocated_capacity = *psVar13;
                vertTemplate.m_template._M_dataplus._M_p = (pointer)*plVar7;
              }
              vertTemplate.m_template._M_string_length = plVar7[1];
              *plVar7 = (long)psVar13;
              plVar7[1] = 0;
              *(undefined1 *)(plVar7 + 2) = 0;
              plVar7 = (long *)std::__cxx11::string::append((char *)&vertTemplate);
              _frag = &local_1a0;
              plVar12 = plVar7 + 2;
              if ((long *)*plVar7 == plVar12) {
                local_1a0 = *plVar12;
                lStack_198 = plVar7[3];
              }
              else {
                local_1a0 = *plVar12;
                _frag = (long *)*plVar7;
              }
              *plVar7 = (long)plVar12;
              plVar7[1] = 0;
              *(undefined1 *)(plVar7 + 2) = 0;
              plVar7 = (long *)std::__cxx11::string::append((char *)&frag);
              _vtx = &local_358;
              plVar12 = plVar7 + 2;
              if ((long *)*plVar7 == plVar12) {
                local_358 = *plVar12;
                lStack_350 = plVar7[3];
              }
              else {
                local_358 = *plVar12;
                _vtx = (long *)*plVar7;
              }
              *plVar7 = (long)plVar12;
              plVar7[1] = 0;
              *(undefined1 *)(plVar7 + 2) = 0;
              plVar7 = (long *)std::__cxx11::string::append((char *)&vtx);
              name._M_dataplus._M_p = (pointer)&name.field_2;
              psVar13 = (size_type *)(plVar7 + 2);
              if ((size_type *)*plVar7 == psVar13) {
                name.field_2._M_allocated_capacity = *psVar13;
                name.field_2._8_8_ = plVar7[3];
              }
              else {
                name.field_2._M_allocated_capacity = *psVar13;
                name._M_dataplus._M_p = (pointer)*plVar7;
              }
              name._M_string_length = plVar7[1];
              *plVar7 = (long)psVar13;
              plVar7[1] = 0;
              *(undefined1 *)(plVar7 + 2) = 0;
              if (_vtx != &local_358) {
                operator_delete(_vtx,local_358 + 1);
              }
              if (_frag != &local_1a0) {
                operator_delete(_frag,local_1a0 + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)vertTemplate.m_template._M_dataplus._M_p != &vertTemplate.m_template.field_2) {
                operator_delete(vertTemplate.m_template._M_dataplus._M_p,
                                vertTemplate.m_template.field_2._M_allocated_capacity + 1);
              }
              if ((_Base_ptr *)params._M_t._M_impl._0_8_ !=
                  &params._M_t._M_impl.super__Rb_tree_header._M_header._M_parent) {
                operator_delete((void *)params._M_t._M_impl._0_8_,
                                (ulong)((long)&(params._M_t._M_impl.super__Rb_tree_header._M_header.
                                               _M_parent)->_M_color + 1));
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)fragTemplate.m_template._M_dataplus._M_p != &fragTemplate.m_template.field_2) {
                operator_delete(fragTemplate.m_template._M_dataplus._M_p,
                                fragTemplate.m_template.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)vertexShaderSource._M_dataplus._M_p != &vertexShaderSource.field_2) {
                operator_delete(vertexShaderSource._M_dataplus._M_p,
                                vertexShaderSource.field_2._M_allocated_capacity + 1);
              }
              vertexShaderSource._M_dataplus._M_p = (pointer)&vertexShaderSource.field_2;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&vertexShaderSource,"Temporary array with ","");
              plVar7 = (long *)std::__cxx11::string::append((char *)&vertexShaderSource);
              fragTemplate.m_template._M_dataplus._M_p = (pointer)&fragTemplate.m_template.field_2;
              psVar13 = (size_type *)(plVar7 + 2);
              if ((size_type *)*plVar7 == psVar13) {
                fragTemplate.m_template.field_2._M_allocated_capacity = *psVar13;
                fragTemplate.m_template.field_2._8_8_ = plVar7[3];
              }
              else {
                fragTemplate.m_template.field_2._M_allocated_capacity = *psVar13;
                fragTemplate.m_template._M_dataplus._M_p = (pointer)*plVar7;
              }
              fragTemplate.m_template._M_string_length = plVar7[1];
              *plVar7 = (long)psVar13;
              plVar7[1] = 0;
              *(undefined1 *)(plVar7 + 2) = 0;
              plVar7 = (long *)std::__cxx11::string::append((char *)&fragTemplate);
              params._M_t._M_impl._0_8_ =
                   &params._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
              plVar12 = plVar7 + 2;
              if ((long *)*plVar7 == plVar12) {
                params._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)*plVar12;
                params._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)plVar7[3];
              }
              else {
                params._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)*plVar12;
                params._M_t._M_impl._0_8_ = (long *)*plVar7;
              }
              params._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ = plVar7[1];
              *plVar7 = (long)plVar12;
              plVar7[1] = 0;
              *(undefined1 *)(plVar7 + 2) = 0;
              plVar7 = (long *)std::__cxx11::string::append((char *)&params);
              vertTemplate.m_template._M_dataplus._M_p = (pointer)&vertTemplate.m_template.field_2;
              psVar13 = (size_type *)(plVar7 + 2);
              if ((size_type *)*plVar7 == psVar13) {
                vertTemplate.m_template.field_2._M_allocated_capacity = *psVar13;
                vertTemplate.m_template.field_2._8_8_ = plVar7[3];
              }
              else {
                vertTemplate.m_template.field_2._M_allocated_capacity = *psVar13;
                vertTemplate.m_template._M_dataplus._M_p = (pointer)*plVar7;
              }
              vertTemplate.m_template._M_string_length = plVar7[1];
              *plVar7 = (long)psVar13;
              plVar7[1] = 0;
              *(undefined1 *)(plVar7 + 2) = 0;
              plVar7 = (long *)std::__cxx11::string::append((char *)&vertTemplate);
              _frag = &local_1a0;
              plVar12 = plVar7 + 2;
              if ((long *)*plVar7 == plVar12) {
                local_1a0 = *plVar12;
                lStack_198 = plVar7[3];
              }
              else {
                local_1a0 = *plVar12;
                _frag = (long *)*plVar7;
              }
              *plVar7 = (long)plVar12;
              plVar7[1] = 0;
              *(undefined1 *)(plVar7 + 2) = 0;
              plVar7 = (long *)std::__cxx11::string::append((char *)&frag);
              _vtx = &local_358;
              plVar12 = plVar7 + 2;
              if ((long *)*plVar7 == plVar12) {
                local_358 = *plVar12;
                lStack_350 = plVar7[3];
              }
              else {
                local_358 = *plVar12;
                _vtx = (long *)*plVar7;
              }
              *plVar7 = (long)plVar12;
              plVar7[1] = 0;
              *(undefined1 *)(plVar7 + 2) = 0;
              plVar7 = (long *)std::__cxx11::string::append((char *)&vtx);
              desc._M_dataplus._M_p = (pointer)&desc.field_2;
              psVar13 = (size_type *)(plVar7 + 2);
              if ((size_type *)*plVar7 == psVar13) {
                desc.field_2._M_allocated_capacity = *psVar13;
                desc.field_2._8_8_ = plVar7[3];
              }
              else {
                desc.field_2._M_allocated_capacity = *psVar13;
                desc._M_dataplus._M_p = (pointer)*plVar7;
              }
              desc._M_string_length = plVar7[1];
              *plVar7 = (long)psVar13;
              plVar7[1] = 0;
              *(undefined1 *)(plVar7 + 2) = 0;
              if (_vtx != &local_358) {
                operator_delete(_vtx,local_358 + 1);
              }
              if (_frag != &local_1a0) {
                operator_delete(_frag,local_1a0 + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)vertTemplate.m_template._M_dataplus._M_p != &vertTemplate.m_template.field_2) {
                operator_delete(vertTemplate.m_template._M_dataplus._M_p,
                                vertTemplate.m_template.field_2._M_allocated_capacity + 1);
              }
              if ((_Base_ptr *)params._M_t._M_impl._0_8_ !=
                  &params._M_t._M_impl.super__Rb_tree_header._M_header._M_parent) {
                operator_delete((void *)params._M_t._M_impl._0_8_,
                                (ulong)((long)&(params._M_t._M_impl.super__Rb_tree_header._M_header.
                                               _M_parent)->_M_color + 1));
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)fragTemplate.m_template._M_dataplus._M_p != &fragTemplate.m_template.field_2) {
                operator_delete(fragTemplate.m_template._M_dataplus._M_p,
                                fragTemplate.m_template.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)vertexShaderSource._M_dataplus._M_p != &vertexShaderSource.field_2) {
                operator_delete(vertexShaderSource._M_dataplus._M_p,
                                vertexShaderSource.field_2._M_allocated_capacity + 1);
              }
              pTVar2 = (this->super_TestCaseGroup).super_TestNode.m_testCtx;
              std::__cxx11::ostringstream::ostringstream((ostringstream *)&vtx);
              std::__cxx11::ostringstream::ostringstream((ostringstream *)&frag);
              poVar21 = (ostringstream *)&frag;
              if (bVar17) {
                poVar21 = (ostringstream *)&vtx;
              }
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&vtx,"#version 310 es\n",0x10);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&frag,"#version 310 es\n",0x10);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&vtx,"layout(location = 0) in highp vec4 a_position;\n",0x2f);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&vtx,"layout(location = 1) in highp vec4 a_coords;\n",0x2d);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&frag,"layout(location = 0) out mediump vec4 o_color;\n",0x2f);
              if (bVar17 == false) {
                lVar19 = 0x2f;
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&vtx,"layout(location = 0) out mediump vec4 v_coords;\n",0x30)
                ;
                pcVar11 = "layout(location = 0) in mediump vec4 v_coords;\n";
              }
              else {
                lVar19 = 0x2e;
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&vtx,"layout(location = 0) out mediump vec4 v_color;\n",0x2f);
                pcVar11 = "layout(location = 0) in mediump vec4 v_color;\n";
              }
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&frag,pcVar11,lVar19);
              if ((char)local_390 != '\0') {
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)poVar21,
                           "layout(std140, binding = 0) uniform something0 { mediump int ui_zero; };\n"
                           ,0x49);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)poVar21,
                           "layout(std140, binding = 1) uniform something1 { mediump int ui_one; };\n"
                           ,0x48);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)poVar21,
                           "layout(std140, binding = 2) uniform something2 { mediump int ui_two; };\n"
                           ,0x48);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)poVar21,
                           "layout(std140, binding = 3) uniform something3 { mediump int ui_three; };\n"
                           ,0x4a);
              }
              if (lVar15 == 3 || lVar14 == 3) {
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)poVar21,
                           "layout(std140, binding = 4) uniform something4 { mediump int ui_four; };\n"
                           ,0x49);
              }
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&vtx,"\n",1);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&vtx,"void main()\n",0xc);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&vtx,"{\n",2);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&vtx,"\tgl_Position = a_position;\n",0x1b);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&frag,"\n",1);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&frag,"void main()\n",0xc);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&frag,"{\n",2);
              pcVar11 = "\t${PRECISION} ${VAR_TYPE} coords = ${VAR_TYPE}(v_coords);\n";
              if (bVar17 != false) {
                pcVar11 = "\t${PRECISION} ${VAR_TYPE} coords = ${VAR_TYPE}(a_coords);\n";
              }
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar21,pcVar11,0x3a);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)poVar21,"\t${PRECISION} ${VAR_TYPE} arr[${ARRAY_LEN}];\n",0x2d);
              if (lVar14 == 0) {
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)poVar21,"\tarr[0] = ${VAR_TYPE}(coords);\n",0x1f);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)poVar21,"\tarr[1] = ${VAR_TYPE}(coords) * 0.5;\n",0x25);
                lVar19 = 0x27;
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)poVar21,"\tarr[2] = ${VAR_TYPE}(coords) * 0.25;\n",0x26);
                pcVar11 = "\tarr[3] = ${VAR_TYPE}(coords) * 0.125;\n";
              }
              else if (lVar14 == 1) {
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)poVar21,"\tarr[ui_zero]  = ${VAR_TYPE}(coords);\n",0x26);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)poVar21,"\tarr[ui_one]   = ${VAR_TYPE}(coords) * 0.5;\n",0x2c)
                ;
                lVar19 = 0x2e;
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)poVar21,"\tarr[ui_two]   = ${VAR_TYPE}(coords) * 0.25;\n",0x2d
                          );
                pcVar11 = "\tarr[ui_three] = ${VAR_TYPE}(coords) * 0.125;\n";
              }
              else {
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)poVar21,local_380,local_388);
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar21,"\t{\n",3);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)poVar21,"\t\tarr[i] = ${VAR_TYPE}(coords);\n",0x20);
                lVar19 = 3;
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)poVar21,"\t\tcoords = coords * 0.5;\n",0x19);
                pcVar11 = "\t}\n";
              }
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar21,pcVar11,lVar19);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)poVar21,"\t${PRECISION} ${VAR_TYPE} res = ${VAR_TYPE}(0.0);\n",
                         0x32);
              if (lVar15 == 0) {
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)poVar21,"\tres += arr[0];\n",0x10);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)poVar21,"\tres += arr[1];\n",0x10);
                lVar19 = 0x10;
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)poVar21,"\tres += arr[2];\n",0x10);
                pcVar11 = "\tres += arr[3];\n";
              }
              else if (lVar15 == 1) {
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)poVar21,"\tres += arr[ui_zero];\n",0x16);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)poVar21,"\tres += arr[ui_one];\n",0x15);
                lVar19 = 0x17;
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)poVar21,"\tres += arr[ui_two];\n",0x15);
                pcVar11 = "\tres += arr[ui_three];\n";
              }
              else {
                lVar19 = 0x11;
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)poVar21,local_378,lVar18);
                pcVar11 = "\t\tres += arr[i];\n";
              }
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar21,pcVar11,lVar19);
              if (bVar17 == false) {
                lVar19 = 0x20;
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&vtx,"\tv_coords = a_coords;\n",0x16);
                pcVar11 = "\to_color = vec4(res${PADDING});\n";
              }
              else {
                lVar19 = 0x14;
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&vtx,"\tv_color = vec4(res${PADDING});\n",0x20);
                pcVar11 = "\to_color = v_color;\n";
              }
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&frag,pcVar11,lVar19);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&vtx,"}\n",2);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&frag,"}\n",2);
              params._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
                   params._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ & 0xffffffff00000000;
              params._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
              params._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
                   &params._M_t._M_impl.super__Rb_tree_header._M_header;
              params._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
              params._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
                   params._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
              fragTemplate.m_template._M_dataplus._M_p = glu::getDataTypeName(DVar1);
              std::
              pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::pair<const_char_(&)[9],_const_char_*,_true>
                        ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&vertTemplate,(char (*) [9])0xaef266,(char **)&fragTemplate);
              std::
              _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
              ::_M_emplace_unique<std::pair<std::__cxx11::string,std::__cxx11::string>>
                        ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                          *)&params,
                         (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&vertTemplate);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_4c8._M_p != &local_4b8) {
                operator_delete(local_4c8._M_p,local_4b8._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)vertTemplate.m_template._M_dataplus._M_p != &vertTemplate.m_template.field_2) {
                operator_delete(vertTemplate.m_template._M_dataplus._M_p,
                                vertTemplate.m_template.field_2._M_allocated_capacity + 1);
              }
              std::
              pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::pair<const_char_(&)[10],_const_char_(&)[2],_true>
                        ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&vertTemplate,(char (*) [10])"ARRAY_LEN",(char (*) [2])0xaf4684);
              std::
              _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
              ::_M_emplace_unique<std::pair<std::__cxx11::string,std::__cxx11::string>>
                        ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                          *)&params,
                         (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&vertTemplate);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_4c8._M_p != &local_4b8) {
                operator_delete(local_4c8._M_p,local_4b8._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)vertTemplate.m_template._M_dataplus._M_p != &vertTemplate.m_template.field_2) {
                operator_delete(vertTemplate.m_template._M_dataplus._M_p,
                                vertTemplate.m_template.field_2._M_allocated_capacity + 1);
              }
              std::
              pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::pair<const_char_(&)[10],_const_char_(&)[8],_true>
                        ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&vertTemplate,(char (*) [10])0xaef277,(char (*) [8])0xb2c06a);
              std::
              _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
              ::_M_emplace_unique<std::pair<std::__cxx11::string,std::__cxx11::string>>
                        ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                          *)&params,
                         (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&vertTemplate);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_4c8._M_p != &local_4b8) {
                operator_delete(local_4c8._M_p,local_4b8._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)vertTemplate.m_template._M_dataplus._M_p != &vertTemplate.m_template.field_2) {
                operator_delete(vertTemplate.m_template._M_dataplus._M_p,
                                vertTemplate.m_template.field_2._M_allocated_capacity + 1);
              }
              if (DVar1 == TYPE_FLOAT_VEC3) {
                std::
                pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::pair<const_char_(&)[8],_const_char_(&)[6],_true>
                          ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&vertTemplate,(char (*) [8])"PADDING",(char (*) [6])0xaf8ed4);
                std::
                _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                ::_M_emplace_unique<std::pair<std::__cxx11::string,std::__cxx11::string>>
                          ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                            *)&params,
                           (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&vertTemplate);
              }
              else if (DVar1 == TYPE_FLOAT_VEC2) {
                std::
                pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::pair<const_char_(&)[8],_const_char_(&)[11],_true>
                          ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&vertTemplate,(char (*) [8])"PADDING",(char (*) [11])0xaf8ecf);
                std::
                _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                ::_M_emplace_unique<std::pair<std::__cxx11::string,std::__cxx11::string>>
                          ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                            *)&params,
                           (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&vertTemplate);
              }
              else if (DVar1 == TYPE_FLOAT) {
                std::
                pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::pair<const_char_(&)[8],_const_char_(&)[16],_true>
                          ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&vertTemplate,(char (*) [8])"PADDING",(char (*) [16])0xaf8f20);
                std::
                _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                ::_M_emplace_unique<std::pair<std::__cxx11::string,std::__cxx11::string>>
                          ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                            *)&params,
                           (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&vertTemplate);
              }
              else {
                std::
                pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::pair<const_char_(&)[8],_const_char_(&)[1],_true>
                          ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&vertTemplate,(char (*) [8])"PADDING",(char (*) [1])0xa99b87);
                std::
                _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                ::_M_emplace_unique<std::pair<std::__cxx11::string,std::__cxx11::string>>
                          ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                            *)&params,
                           (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&vertTemplate);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_4c8._M_p != &local_4b8) {
                operator_delete(local_4c8._M_p,local_4b8._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)vertTemplate.m_template._M_dataplus._M_p != &vertTemplate.m_template.field_2) {
                operator_delete(vertTemplate.m_template._M_dataplus._M_p,
                                vertTemplate.m_template.field_2._M_allocated_capacity + 1);
              }
              std::__cxx11::stringbuf::str();
              tcu::StringTemplate::StringTemplate(&vertTemplate,&fragTemplate.m_template);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)fragTemplate.m_template._M_dataplus._M_p != &fragTemplate.m_template.field_2) {
                operator_delete(fragTemplate.m_template._M_dataplus._M_p,
                                fragTemplate.m_template.field_2._M_allocated_capacity + 1);
              }
              std::__cxx11::stringbuf::str();
              tcu::StringTemplate::StringTemplate(&fragTemplate,&vertexShaderSource);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)vertexShaderSource._M_dataplus._M_p != &vertexShaderSource.field_2) {
                operator_delete(vertexShaderSource._M_dataplus._M_p,
                                vertexShaderSource.field_2._M_allocated_capacity + 1);
              }
              tcu::StringTemplate::specialize(&vertexShaderSource,&vertTemplate,&params);
              tcu::StringTemplate::specialize(&local_3b0,&fragTemplate,&params);
              if ((uint)local_370 < 4) {
                p_Var20 = (ShaderEvalFunc)(&PTR_evalArrayCoordsFloat_00cf6c20)[local_370];
              }
              else {
                p_Var20 = (ShaderEvalFunc)0x0;
              }
              pTVar8 = (TestNode *)operator_new(0xe0);
              ShaderIndexingCase::ShaderIndexingCase
                        ((ShaderIndexingCase *)pTVar8,pTVar2,&name,&desc,bVar17,p_Var20,
                         &vertexShaderSource,&local_3b0,DVar1,false);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_3b0._M_dataplus._M_p != &local_3b0.field_2) {
                operator_delete(local_3b0._M_dataplus._M_p,
                                local_3b0.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)vertexShaderSource._M_dataplus._M_p != &vertexShaderSource.field_2) {
                operator_delete(vertexShaderSource._M_dataplus._M_p,
                                vertexShaderSource.field_2._M_allocated_capacity + 1);
              }
              tcu::StringTemplate::~StringTemplate(&fragTemplate);
              tcu::StringTemplate::~StringTemplate(&vertTemplate);
              std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::~_Rb_tree(&params._M_t);
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)&frag);
              std::ios_base::~ios_base(local_140);
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)&vtx);
              std::ios_base::~ios_base(local_2f8);
              tcu::TestNode::addChild(pTVar5,pTVar8);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)desc._M_dataplus._M_p != &desc.field_2) {
                operator_delete(desc._M_dataplus._M_p,desc.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)name._M_dataplus._M_p != &name.field_2) {
                operator_delete(name._M_dataplus._M_p,name.field_2._M_allocated_capacity + 1);
              }
              lVar19 = 1;
              bVar22 = bVar17 != false;
              bVar17 = false;
            } while (bVar22);
            lVar15 = lVar15 + 1;
          } while (lVar15 != 4);
          lVar14 = lVar14 + 1;
        } while (lVar14 != 4);
        lVar15 = local_38 + 1;
      } while (lVar15 != 4);
      tcu::TestNode::addChild((TestNode *)this,pTVar5);
      pTVar5 = (TestNode *)operator_new(0x70);
      tcu::TestCaseGroup::TestCaseGroup
                ((TestCaseGroup *)pTVar5,(this->super_TestCaseGroup).super_TestNode.m_testCtx,
                 "vector_subscript","Vector subscript indexing.");
      lVar15 = 0;
      do {
        DVar1 = init::s_vectorTypes[lVar15];
        local_380 = (char *)(ulong)(DVar1 - TYPE_FLOAT_VEC2);
        lVar14 = 0;
        local_388 = lVar15;
        do {
          lVar15 = 0;
          do {
            local_370 = CONCAT71(local_370._1_7_,lVar15 == 3 || lVar14 == 3);
            local_378 = (char *)CONCAT71(local_378._1_7_,lVar15 == 5 || lVar14 == 5);
            bVar17 = true;
            lVar18 = 0;
            do {
              glu::getShaderTypeName
                        (tessellation::createCommonEdgeTests(tcu::TestContext&)::primitiveTypes
                         [lVar18]);
              pcVar11 = glu::getDataTypeName(DVar1);
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&vertexShaderSource,pcVar11,(allocator<char> *)&local_3b0);
              plVar7 = (long *)std::__cxx11::string::append((char *)&vertexShaderSource);
              fragTemplate.m_template._M_dataplus._M_p = (pointer)&fragTemplate.m_template.field_2;
              psVar13 = (size_type *)(plVar7 + 2);
              if ((size_type *)*plVar7 == psVar13) {
                fragTemplate.m_template.field_2._M_allocated_capacity = *psVar13;
                fragTemplate.m_template.field_2._8_8_ = plVar7[3];
              }
              else {
                fragTemplate.m_template.field_2._M_allocated_capacity = *psVar13;
                fragTemplate.m_template._M_dataplus._M_p = (pointer)*plVar7;
              }
              fragTemplate.m_template._M_string_length = plVar7[1];
              *plVar7 = (long)psVar13;
              plVar7[1] = 0;
              *(undefined1 *)(plVar7 + 2) = 0;
              plVar7 = (long *)std::__cxx11::string::append((char *)&fragTemplate.m_template);
              params._M_t._M_impl._0_8_ =
                   &params._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
              plVar12 = plVar7 + 2;
              if ((long *)*plVar7 == plVar12) {
                params._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)*plVar12;
                params._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)plVar7[3];
              }
              else {
                params._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)*plVar12;
                params._M_t._M_impl._0_8_ = (long *)*plVar7;
              }
              params._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ = plVar7[1];
              *plVar7 = (long)plVar12;
              plVar7[1] = 0;
              *(undefined1 *)(plVar7 + 2) = 0;
              plVar7 = (long *)std::__cxx11::string::append((char *)&params);
              vertTemplate.m_template._M_dataplus._M_p = (pointer)&vertTemplate.m_template.field_2;
              psVar13 = (size_type *)(plVar7 + 2);
              if ((size_type *)*plVar7 == psVar13) {
                vertTemplate.m_template.field_2._M_allocated_capacity = *psVar13;
                vertTemplate.m_template.field_2._8_8_ = plVar7[3];
              }
              else {
                vertTemplate.m_template.field_2._M_allocated_capacity = *psVar13;
                vertTemplate.m_template._M_dataplus._M_p = (pointer)*plVar7;
              }
              vertTemplate.m_template._M_string_length = plVar7[1];
              *plVar7 = (long)psVar13;
              plVar7[1] = 0;
              *(undefined1 *)(plVar7 + 2) = 0;
              plVar7 = (long *)std::__cxx11::string::append((char *)&vertTemplate);
              _frag = &local_1a0;
              plVar12 = plVar7 + 2;
              if ((long *)*plVar7 == plVar12) {
                local_1a0 = *plVar12;
                lStack_198 = plVar7[3];
              }
              else {
                local_1a0 = *plVar12;
                _frag = (long *)*plVar7;
              }
              *plVar7 = (long)plVar12;
              plVar7[1] = 0;
              *(undefined1 *)(plVar7 + 2) = 0;
              plVar7 = (long *)std::__cxx11::string::append((char *)&frag);
              _vtx = &local_358;
              plVar12 = plVar7 + 2;
              if ((long *)*plVar7 == plVar12) {
                local_358 = *plVar12;
                lStack_350 = plVar7[3];
              }
              else {
                local_358 = *plVar12;
                _vtx = (long *)*plVar7;
              }
              *plVar7 = (long)plVar12;
              plVar7[1] = 0;
              *(undefined1 *)(plVar7 + 2) = 0;
              plVar7 = (long *)std::__cxx11::string::append((char *)&vtx);
              name._M_dataplus._M_p = (pointer)&name.field_2;
              psVar13 = (size_type *)(plVar7 + 2);
              if ((size_type *)*plVar7 == psVar13) {
                name.field_2._M_allocated_capacity = *psVar13;
                name.field_2._8_8_ = plVar7[3];
              }
              else {
                name.field_2._M_allocated_capacity = *psVar13;
                name._M_dataplus._M_p = (pointer)*plVar7;
              }
              name._M_string_length = plVar7[1];
              *plVar7 = (long)psVar13;
              plVar7[1] = 0;
              *(undefined1 *)(plVar7 + 2) = 0;
              if (_vtx != &local_358) {
                operator_delete(_vtx,local_358 + 1);
              }
              if (_frag != &local_1a0) {
                operator_delete(_frag,local_1a0 + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)vertTemplate.m_template._M_dataplus._M_p != &vertTemplate.m_template.field_2) {
                operator_delete(vertTemplate.m_template._M_dataplus._M_p,
                                vertTemplate.m_template.field_2._M_allocated_capacity + 1);
              }
              if ((_Base_ptr *)params._M_t._M_impl._0_8_ !=
                  &params._M_t._M_impl.super__Rb_tree_header._M_header._M_parent) {
                operator_delete((void *)params._M_t._M_impl._0_8_,
                                (ulong)((long)&(params._M_t._M_impl.super__Rb_tree_header._M_header.
                                               _M_parent)->_M_color + 1));
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)fragTemplate.m_template._M_dataplus._M_p != &fragTemplate.m_template.field_2) {
                operator_delete(fragTemplate.m_template._M_dataplus._M_p,
                                fragTemplate.m_template.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)vertexShaderSource._M_dataplus._M_p != &vertexShaderSource.field_2) {
                operator_delete(vertexShaderSource._M_dataplus._M_p,
                                vertexShaderSource.field_2._M_allocated_capacity + 1);
              }
              vertexShaderSource._M_dataplus._M_p = (pointer)&vertexShaderSource.field_2;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&vertexShaderSource,"Vector subscript access with ","");
              plVar7 = (long *)std::__cxx11::string::append((char *)&vertexShaderSource);
              fragTemplate.m_template._M_dataplus._M_p = (pointer)&fragTemplate.m_template.field_2;
              psVar13 = (size_type *)(plVar7 + 2);
              if ((size_type *)*plVar7 == psVar13) {
                fragTemplate.m_template.field_2._M_allocated_capacity = *psVar13;
                fragTemplate.m_template.field_2._8_8_ = plVar7[3];
              }
              else {
                fragTemplate.m_template.field_2._M_allocated_capacity = *psVar13;
                fragTemplate.m_template._M_dataplus._M_p = (pointer)*plVar7;
              }
              fragTemplate.m_template._M_string_length = plVar7[1];
              *plVar7 = (long)psVar13;
              plVar7[1] = 0;
              *(undefined1 *)(plVar7 + 2) = 0;
              plVar7 = (long *)std::__cxx11::string::append((char *)&fragTemplate.m_template);
              params._M_t._M_impl._0_8_ =
                   &params._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
              plVar12 = plVar7 + 2;
              if ((long *)*plVar7 == plVar12) {
                params._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)*plVar12;
                params._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)plVar7[3];
              }
              else {
                params._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)*plVar12;
                params._M_t._M_impl._0_8_ = (long *)*plVar7;
              }
              params._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ = plVar7[1];
              *plVar7 = (long)plVar12;
              plVar7[1] = 0;
              *(undefined1 *)(plVar7 + 2) = 0;
              plVar7 = (long *)std::__cxx11::string::append((char *)&params);
              vertTemplate.m_template._M_dataplus._M_p = (pointer)&vertTemplate.m_template.field_2;
              psVar13 = (size_type *)(plVar7 + 2);
              if ((size_type *)*plVar7 == psVar13) {
                vertTemplate.m_template.field_2._M_allocated_capacity = *psVar13;
                vertTemplate.m_template.field_2._8_8_ = plVar7[3];
              }
              else {
                vertTemplate.m_template.field_2._M_allocated_capacity = *psVar13;
                vertTemplate.m_template._M_dataplus._M_p = (pointer)*plVar7;
              }
              vertTemplate.m_template._M_string_length = plVar7[1];
              *plVar7 = (long)psVar13;
              plVar7[1] = 0;
              *(undefined1 *)(plVar7 + 2) = 0;
              plVar7 = (long *)std::__cxx11::string::append((char *)&vertTemplate);
              _frag = &local_1a0;
              plVar12 = plVar7 + 2;
              if ((long *)*plVar7 == plVar12) {
                local_1a0 = *plVar12;
                lStack_198 = plVar7[3];
              }
              else {
                local_1a0 = *plVar12;
                _frag = (long *)*plVar7;
              }
              *plVar7 = (long)plVar12;
              plVar7[1] = 0;
              *(undefined1 *)(plVar7 + 2) = 0;
              plVar7 = (long *)std::__cxx11::string::append((char *)&frag);
              _vtx = &local_358;
              plVar12 = plVar7 + 2;
              if ((long *)*plVar7 == plVar12) {
                local_358 = *plVar12;
                lStack_350 = plVar7[3];
              }
              else {
                local_358 = *plVar12;
                _vtx = (long *)*plVar7;
              }
              *plVar7 = (long)plVar12;
              plVar7[1] = 0;
              *(undefined1 *)(plVar7 + 2) = 0;
              plVar7 = (long *)std::__cxx11::string::append((char *)&vtx);
              desc._M_dataplus._M_p = (pointer)&desc.field_2;
              psVar13 = (size_type *)(plVar7 + 2);
              if ((size_type *)*plVar7 == psVar13) {
                desc.field_2._M_allocated_capacity = *psVar13;
                desc.field_2._8_8_ = plVar7[3];
              }
              else {
                desc.field_2._M_allocated_capacity = *psVar13;
                desc._M_dataplus._M_p = (pointer)*plVar7;
              }
              desc._M_string_length = plVar7[1];
              *plVar7 = (long)psVar13;
              plVar7[1] = 0;
              *(undefined1 *)(plVar7 + 2) = 0;
              if (_vtx != &local_358) {
                operator_delete(_vtx,local_358 + 1);
              }
              if (_frag != &local_1a0) {
                operator_delete(_frag,local_1a0 + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)vertTemplate.m_template._M_dataplus._M_p != &vertTemplate.m_template.field_2) {
                operator_delete(vertTemplate.m_template._M_dataplus._M_p,
                                vertTemplate.m_template.field_2._M_allocated_capacity + 1);
              }
              if ((_Base_ptr *)params._M_t._M_impl._0_8_ !=
                  &params._M_t._M_impl.super__Rb_tree_header._M_header._M_parent) {
                operator_delete((void *)params._M_t._M_impl._0_8_,
                                (ulong)((long)&(params._M_t._M_impl.super__Rb_tree_header._M_header.
                                               _M_parent)->_M_color + 1));
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)fragTemplate.m_template._M_dataplus._M_p != &fragTemplate.m_template.field_2) {
                operator_delete(fragTemplate.m_template._M_dataplus._M_p,
                                fragTemplate.m_template.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)vertexShaderSource._M_dataplus._M_p != &vertexShaderSource.field_2) {
                operator_delete(vertexShaderSource._M_dataplus._M_p,
                                vertexShaderSource.field_2._M_allocated_capacity + 1);
              }
              pTVar2 = (this->super_TestCaseGroup).super_TestNode.m_testCtx;
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_1d0,name._M_dataplus._M_p,&local_411);
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_1f0,desc._M_dataplus._M_p,&local_412);
              std::__cxx11::ostringstream::ostringstream((ostringstream *)&vtx);
              local_390 = pTVar2;
              std::__cxx11::ostringstream::ostringstream((ostringstream *)&frag);
              poVar21 = (ostringstream *)&frag;
              if (bVar17) {
                poVar21 = (ostringstream *)&vtx;
              }
              uVar3 = glu::getDataTypeScalarSize(DVar1);
              pcVar11 = getIntUniformName(uVar3);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&vtx,"#version 310 es\n",0x10);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&frag,"#version 310 es\n",0x10);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&vtx,"layout(location = 0) in highp vec4 a_position;\n",0x2f);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&vtx,"layout(location = 1) in highp vec4 a_coords;\n",0x2d);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&frag,"layout(location = 0) out mediump vec4 o_color;\n",0x2f);
              if (bVar17 == false) {
                lVar18 = 0x2f;
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&vtx,"layout(location = 0) out mediump vec4 v_coords;\n",0x30)
                ;
                pcVar6 = "layout(location = 0) in mediump vec4 v_coords;\n";
              }
              else {
                lVar18 = 0x2e;
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&vtx,"layout(location = 0) out mediump vec3 v_color;\n",0x2f);
                pcVar6 = "layout(location = 0) in mediump vec3 v_color;\n";
              }
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&frag,pcVar6,lVar18);
              if (((((char)local_370 != '\0') &&
                   (std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)poVar21,
                               "layout(std140, binding = 0) uniform something0 { mediump int ui_zero; };\n"
                               ,0x49), 1 < (int)uVar3)) &&
                  (std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)poVar21,
                              "layout(std140, binding = 1) uniform something1 { mediump int ui_one; };\n"
                              ,0x48), uVar3 != 2)) &&
                 (std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)poVar21,
                             "layout(std140, binding = 2) uniform something2 { mediump int ui_two; };\n"
                             ,0x48), 3 < uVar3)) {
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)poVar21,
                           "layout(std140, binding = 3) uniform something3 { mediump int ui_three; };\n"
                           ,0x4a);
              }
              if ((char)local_378 != '\0') {
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)poVar21,"layout(std140, binding = ",0x19);
                poVar9 = (ostream *)std::ostream::operator<<(poVar21,uVar3);
                std::__ostream_insert<char,std::char_traits<char>>
                          (poVar9,") uniform something",0x13);
                poVar9 = (ostream *)std::ostream::operator<<(poVar9,uVar3);
                std::__ostream_insert<char,std::char_traits<char>>(poVar9," { mediump int ",0xf);
                sVar10 = strlen(pcVar11);
                std::__ostream_insert<char,std::char_traits<char>>(poVar9,pcVar11,sVar10);
                std::__ostream_insert<char,std::char_traits<char>>(poVar9,"; };\n",5);
              }
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&vtx,"\n",1);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&vtx,"void main()\n",0xc);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&vtx,"{\n",2);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&vtx,"\tgl_Position = a_position;\n",0x1b);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&frag,"\n",1);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&frag,"void main()\n",0xc);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&frag,"{\n",2);
              pcVar6 = "\t${PRECISION} ${VAR_TYPE} coords = ${VAR_TYPE}(v_coords);\n";
              if (bVar17 != false) {
                pcVar6 = "\t${PRECISION} ${VAR_TYPE} coords = ${VAR_TYPE}(a_coords);\n";
              }
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar21,pcVar6,0x3a);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)poVar21,"\t${PRECISION} ${VAR_TYPE} tmp;\n",0x1f);
              iVar4 = (int)lVar14;
              if (iVar4 == 0) {
                lVar18 = 0x43;
                pcVar6 = "\ttmp = coords.${SWIZZLE} * vec4(1.0, 0.5, 0.25, 0.125).${SWIZZLE};\n";
LAB_00575d8b:
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar21,pcVar6,lVar18)
                ;
              }
              else if (iVar4 == 2) {
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)poVar21,"\ttmp[0] = coords.x;\n",0x14);
                if ((1 < (int)uVar3) &&
                   (std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)poVar21,"\ttmp[1] = coords.y * 0.5;\n",0x1a), uVar3 != 2))
                {
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)poVar21,"\ttmp[2] = coords.z * 0.25;\n",0x1b);
                  lVar18 = 0x1c;
                  pcVar6 = "\ttmp[3] = coords.w * 0.125;\n";
LAB_00575ccb:
                  if (3 < uVar3) goto LAB_00575d8b;
                }
              }
              else if (iVar4 == 1) {
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)poVar21,"\ttmp.x = coords.x;\n",0x13);
                if ((1 < (int)uVar3) &&
                   (std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)poVar21,"\ttmp.y = coords.y * 0.5;\n",0x19), uVar3 != 2))
                {
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)poVar21,"\ttmp.z = coords.z * 0.25;\n",0x1a);
                  lVar18 = 0x1b;
                  pcVar6 = "\ttmp.w = coords.w * 0.125;\n";
                  goto LAB_00575ccb;
                }
              }
              else {
                if (lVar14 != 3) {
                  if (lVar14 == 4) {
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)poVar21,"\tfor (int i = 0; i < ",0x15);
                    poVar9 = (ostream *)std::ostream::operator<<(poVar21,uVar3);
                  }
                  else {
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)poVar21,"\tfor (int i = 0; i < ",0x15);
                    sVar10 = strlen(pcVar11);
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)poVar21,pcVar11,sVar10);
                    poVar9 = (ostream *)poVar21;
                  }
                  std::__ostream_insert<char,std::char_traits<char>>(poVar9,"; i++)\n",7);
                  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar21,"\t{\n",3);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)poVar21,"\t\ttmp[i] = coords.x;\n",0x15);
                  lVar18 = 3;
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)poVar21,"\t\tcoords = coords.${ROT_SWIZZLE} * 0.5;\n",0x28);
                  pcVar6 = "\t}\n";
                  goto LAB_00575d8b;
                }
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)poVar21,"\ttmp[ui_zero]  = coords.x;\n",0x1b);
                if ((1 < (int)uVar3) &&
                   (std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)poVar21,"\ttmp[ui_one]   = coords.y * 0.5;\n",0x21),
                   uVar3 != 2)) {
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)poVar21,"\ttmp[ui_two]   = coords.z * 0.25;\n",0x22);
                  lVar18 = 0x23;
                  pcVar6 = "\ttmp[ui_three] = coords.w * 0.125;\n";
                  goto LAB_00575ccb;
                }
              }
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)poVar21,"\t${PRECISION} float res = 0.0;\n",0x1f);
              iVar4 = (int)lVar15;
              if (iVar4 == 0) {
                lVar18 = 0x23;
                pcVar11 = "\tres = dot(tmp, ${VAR_TYPE}(1.0));\n";
LAB_00575f7e:
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)poVar21,pcVar11,lVar18);
              }
              else if (iVar4 == 2) {
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)poVar21,"\tres += tmp[0];\n",0x10);
                if ((1 < (int)uVar3) &&
                   (std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)poVar21,"\tres += tmp[1];\n",0x10), uVar3 != 2)) {
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)poVar21,"\tres += tmp[2];\n",0x10);
                  lVar18 = 0x10;
                  pcVar11 = "\tres += tmp[3];\n";
LAB_00575efe:
                  if (3 < uVar3) goto LAB_00575f7e;
                }
              }
              else if (iVar4 == 1) {
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)poVar21,"\tres += tmp.x;\n",0xf);
                if ((1 < (int)uVar3) &&
                   (std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)poVar21,"\tres += tmp.y;\n",0xf), uVar3 != 2)) {
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)poVar21,"\tres += tmp.z;\n",0xf);
                  lVar18 = 0xf;
                  pcVar11 = "\tres += tmp.w;\n";
                  goto LAB_00575efe;
                }
              }
              else {
                if (lVar15 != 3) {
                  if (lVar15 == 4) {
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)poVar21,"\tfor (int i = 0; i < ",0x15);
                    poVar9 = (ostream *)std::ostream::operator<<(poVar21,uVar3);
                  }
                  else {
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)poVar21,"\tfor (int i = 0; i < ",0x15);
                    sVar10 = strlen(pcVar11);
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)poVar21,pcVar11,sVar10);
                    poVar9 = (ostream *)poVar21;
                  }
                  lVar18 = 0x11;
                  std::__ostream_insert<char,std::char_traits<char>>(poVar9,"; i++)\n",7);
                  pcVar11 = "\t\tres += tmp[i];\n";
                  goto LAB_00575f7e;
                }
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)poVar21,"\tres += tmp[ui_zero];\n",0x16);
                if ((1 < (int)uVar3) &&
                   (std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)poVar21,"\tres += tmp[ui_one];\n",0x15), uVar3 != 2)) {
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)poVar21,"\tres += tmp[ui_two];\n",0x15);
                  lVar18 = 0x17;
                  pcVar11 = "\tres += tmp[ui_three];\n";
                  goto LAB_00575efe;
                }
              }
              if (bVar17 == false) {
                lVar18 = 0x21;
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&vtx,"\tv_coords = a_coords;\n",0x16);
                pcVar11 = "\to_color = vec4(vec3(res), 1.0);\n";
              }
              else {
                lVar18 = 0x23;
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&vtx,"\tv_color = vec3(res);\n",0x16);
                pcVar11 = "\to_color = vec4(v_color.rgb, 1.0);\n";
              }
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&frag,pcVar11,lVar18);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&vtx,"}\n",2);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&frag,"}\n",2);
              params._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
                   params._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ & 0xffffffff00000000;
              params._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
              params._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
                   &params._M_t._M_impl.super__Rb_tree_header._M_header;
              params._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
              params._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
                   params._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
              fragTemplate.m_template._M_dataplus._M_p = glu::getDataTypeName(DVar1);
              std::
              pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::pair<const_char_(&)[9],_const_char_*,_true>
                        ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&vertTemplate,(char (*) [9])0xaef266,(char **)&fragTemplate.m_template);
              std::
              _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
              ::_M_emplace_unique<std::pair<std::__cxx11::string,std::__cxx11::string>>
                        ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                          *)&params,
                         (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&vertTemplate);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_4c8._M_p != &local_4b8) {
                operator_delete(local_4c8._M_p,local_4b8._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)vertTemplate.m_template._M_dataplus._M_p != &vertTemplate.m_template.field_2) {
                operator_delete(vertTemplate.m_template._M_dataplus._M_p,
                                vertTemplate.m_template.field_2._M_allocated_capacity + 1);
              }
              std::
              pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::pair<const_char_(&)[10],_const_char_(&)[8],_true>
                        ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&vertTemplate,(char (*) [10])0xaef277,(char (*) [8])0xb2c06a);
              std::
              _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
              ::_M_emplace_unique<std::pair<std::__cxx11::string,std::__cxx11::string>>
                        ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                          *)&params,
                         (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&vertTemplate);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_4c8._M_p != &local_4b8) {
                operator_delete(local_4c8._M_p,local_4b8._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)vertTemplate.m_template._M_dataplus._M_p != &vertTemplate.m_template.field_2) {
                operator_delete(vertTemplate.m_template._M_dataplus._M_p,
                                vertTemplate.m_template.field_2._M_allocated_capacity + 1);
              }
              std::
              pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::pair<const_char_(&)[8],_const_char_*&,_true>
                        ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&vertTemplate,(char (*) [8])0xaee965,
                         (char **)(sr::(anonymous_namespace)::
                                   createVectorSubscriptCase(tcu::TestContext&,std::__cxx11::string_const&,std::__cxx11::string_const&,bool,glu::DataType,vkt::sr::(anonymous_namespace)::VectorAccessType,vkt::sr::(anonymous_namespace)::VectorAccessType)
                                   ::s_swizzles + (long)(int)uVar3 * 8));
              std::
              _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
              ::_M_emplace_unique<std::pair<std::__cxx11::string,std::__cxx11::string>>
                        ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                          *)&params,
                         (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&vertTemplate);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_4c8._M_p != &local_4b8) {
                operator_delete(local_4c8._M_p,local_4b8._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)vertTemplate.m_template._M_dataplus._M_p != &vertTemplate.m_template.field_2) {
                operator_delete(vertTemplate.m_template._M_dataplus._M_p,
                                vertTemplate.m_template.field_2._M_allocated_capacity + 1);
              }
              std::
              pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::pair<const_char_(&)[12],_const_char_*&,_true>
                        ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&vertTemplate,(char (*) [12])"ROT_SWIZZLE",
                         (char **)(sr::(anonymous_namespace)::
                                   createVectorSubscriptCase(tcu::TestContext&,std::__cxx11::string_const&,std::__cxx11::string_const&,bool,glu::DataType,vkt::sr::(anonymous_namespace)::VectorAccessType,vkt::sr::(anonymous_namespace)::VectorAccessType)
                                   ::s_rotSwizzles + (long)(int)uVar3 * 8));
              std::
              _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
              ::_M_emplace_unique<std::pair<std::__cxx11::string,std::__cxx11::string>>
                        ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                          *)&params,
                         (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&vertTemplate);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_4c8._M_p != &local_4b8) {
                operator_delete(local_4c8._M_p,local_4b8._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)vertTemplate.m_template._M_dataplus._M_p != &vertTemplate.m_template.field_2) {
                operator_delete(vertTemplate.m_template._M_dataplus._M_p,
                                vertTemplate.m_template.field_2._M_allocated_capacity + 1);
              }
              std::__cxx11::stringbuf::str();
              tcu::StringTemplate::StringTemplate(&vertTemplate,&fragTemplate.m_template);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)fragTemplate.m_template._M_dataplus._M_p != &fragTemplate.m_template.field_2) {
                operator_delete(fragTemplate.m_template._M_dataplus._M_p,
                                fragTemplate.m_template.field_2._M_allocated_capacity + 1);
              }
              std::__cxx11::stringbuf::str();
              tcu::StringTemplate::StringTemplate
                        ((StringTemplate *)&fragTemplate.m_template,&vertexShaderSource);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)vertexShaderSource._M_dataplus._M_p != &vertexShaderSource.field_2) {
                operator_delete(vertexShaderSource._M_dataplus._M_p,
                                vertexShaderSource.field_2._M_allocated_capacity + 1);
              }
              tcu::StringTemplate::specialize(&vertexShaderSource,&vertTemplate,&params);
              tcu::StringTemplate::specialize
                        (&local_3b0,(StringTemplate *)&fragTemplate.m_template,&params);
              if ((uint)local_380 < 3) {
                p_Var20 = (ShaderEvalFunc)(&PTR_evalSubscriptVec2_00cf6c40)[(long)local_380];
              }
              else {
                p_Var20 = (ShaderEvalFunc)0x0;
              }
              pTVar8 = (TestNode *)operator_new(0xe0);
              ShaderIndexingCase::ShaderIndexingCase
                        ((ShaderIndexingCase *)pTVar8,local_390,&local_1d0,&local_1f0,bVar17,p_Var20
                         ,&vertexShaderSource,&local_3b0,DVar1,false);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_3b0._M_dataplus._M_p != &local_3b0.field_2) {
                operator_delete(local_3b0._M_dataplus._M_p,
                                local_3b0.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)vertexShaderSource._M_dataplus._M_p != &vertexShaderSource.field_2) {
                operator_delete(vertexShaderSource._M_dataplus._M_p,
                                vertexShaderSource.field_2._M_allocated_capacity + 1);
              }
              tcu::StringTemplate::~StringTemplate((StringTemplate *)&fragTemplate.m_template);
              tcu::StringTemplate::~StringTemplate(&vertTemplate);
              std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)&params);
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)&frag);
              std::ios_base::~ios_base(local_140);
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)&vtx);
              std::ios_base::~ios_base(local_2f8);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
                operator_delete(local_1f0._M_dataplus._M_p,
                                local_1f0.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
                operator_delete(local_1d0._M_dataplus._M_p,
                                local_1d0.field_2._M_allocated_capacity + 1);
              }
              tcu::TestNode::addChild(pTVar5,pTVar8);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)desc._M_dataplus._M_p != &desc.field_2) {
                operator_delete(desc._M_dataplus._M_p,desc.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)name._M_dataplus._M_p != &name.field_2) {
                operator_delete(name._M_dataplus._M_p,name.field_2._M_allocated_capacity + 1);
              }
              lVar18 = 1;
              bVar22 = bVar17 != false;
              bVar17 = false;
            } while (bVar22);
            lVar15 = lVar15 + 1;
          } while (lVar15 != 6);
          lVar14 = lVar14 + 1;
        } while (lVar14 != 6);
        lVar15 = local_388 + 1;
      } while (lVar15 != 3);
      tcu::TestNode::addChild((TestNode *)this,pTVar5);
      pTVar5 = (TestNode *)operator_new(0x70);
      tcu::TestCaseGroup::TestCaseGroup
                ((TestCaseGroup *)pTVar5,(this->super_TestCaseGroup).super_TestNode.m_testCtx,
                 "matrix_subscript","Matrix subscript indexing.");
      local_388 = 0;
      do {
        DVar1 = init::s_matrixTypes[local_388];
        local_380 = (char *)(ulong)(DVar1 - TYPE_FLOAT_MAT2);
        lVar15 = 0;
        do {
          lVar14 = 0;
          do {
            local_370 = CONCAT71(local_370._1_7_,lVar14 == 1 || lVar15 == 1);
            local_378 = (char *)CONCAT71(local_378._1_7_,lVar14 == 3 || lVar15 == 3);
            bVar17 = true;
            lVar18 = 0;
            do {
              glu::getShaderTypeName
                        (tessellation::createCommonEdgeTests(tcu::TestContext&)::primitiveTypes
                         [lVar18]);
              pcVar11 = glu::getDataTypeName(DVar1);
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&vertexShaderSource,pcVar11,(allocator<char> *)&local_3b0);
              plVar7 = (long *)std::__cxx11::string::append((char *)&vertexShaderSource);
              fragTemplate.m_template._M_dataplus._M_p = (pointer)&fragTemplate.m_template.field_2;
              psVar13 = (size_type *)(plVar7 + 2);
              if ((size_type *)*plVar7 == psVar13) {
                fragTemplate.m_template.field_2._M_allocated_capacity = *psVar13;
                fragTemplate.m_template.field_2._8_8_ = plVar7[3];
              }
              else {
                fragTemplate.m_template.field_2._M_allocated_capacity = *psVar13;
                fragTemplate.m_template._M_dataplus._M_p = (pointer)*plVar7;
              }
              fragTemplate.m_template._M_string_length = plVar7[1];
              *plVar7 = (long)psVar13;
              plVar7[1] = 0;
              *(undefined1 *)(plVar7 + 2) = 0;
              plVar7 = (long *)std::__cxx11::string::append((char *)&fragTemplate);
              params._M_t._M_impl._0_8_ =
                   &params._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
              plVar12 = plVar7 + 2;
              if ((long *)*plVar7 == plVar12) {
                params._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)*plVar12;
                params._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)plVar7[3];
              }
              else {
                params._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)*plVar12;
                params._M_t._M_impl._0_8_ = (long *)*plVar7;
              }
              params._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ = plVar7[1];
              *plVar7 = (long)plVar12;
              plVar7[1] = 0;
              *(undefined1 *)(plVar7 + 2) = 0;
              plVar7 = (long *)std::__cxx11::string::append((char *)&params);
              vertTemplate.m_template._M_dataplus._M_p = (pointer)&vertTemplate.m_template.field_2;
              psVar13 = (size_type *)(plVar7 + 2);
              if ((size_type *)*plVar7 == psVar13) {
                vertTemplate.m_template.field_2._M_allocated_capacity = *psVar13;
                vertTemplate.m_template.field_2._8_8_ = plVar7[3];
              }
              else {
                vertTemplate.m_template.field_2._M_allocated_capacity = *psVar13;
                vertTemplate.m_template._M_dataplus._M_p = (pointer)*plVar7;
              }
              vertTemplate.m_template._M_string_length = plVar7[1];
              *plVar7 = (long)psVar13;
              plVar7[1] = 0;
              *(undefined1 *)(plVar7 + 2) = 0;
              plVar7 = (long *)std::__cxx11::string::append((char *)&vertTemplate);
              _frag = &local_1a0;
              plVar12 = plVar7 + 2;
              if ((long *)*plVar7 == plVar12) {
                local_1a0 = *plVar12;
                lStack_198 = plVar7[3];
              }
              else {
                local_1a0 = *plVar12;
                _frag = (long *)*plVar7;
              }
              *plVar7 = (long)plVar12;
              plVar7[1] = 0;
              *(undefined1 *)(plVar7 + 2) = 0;
              plVar7 = (long *)std::__cxx11::string::append((char *)&frag);
              _vtx = &local_358;
              plVar12 = plVar7 + 2;
              if ((long *)*plVar7 == plVar12) {
                local_358 = *plVar12;
                lStack_350 = plVar7[3];
              }
              else {
                local_358 = *plVar12;
                _vtx = (long *)*plVar7;
              }
              *plVar7 = (long)plVar12;
              plVar7[1] = 0;
              *(undefined1 *)(plVar7 + 2) = 0;
              plVar7 = (long *)std::__cxx11::string::append((char *)&vtx);
              name._M_dataplus._M_p = (pointer)&name.field_2;
              psVar13 = (size_type *)(plVar7 + 2);
              if ((size_type *)*plVar7 == psVar13) {
                name.field_2._M_allocated_capacity = *psVar13;
                name.field_2._8_8_ = plVar7[3];
              }
              else {
                name.field_2._M_allocated_capacity = *psVar13;
                name._M_dataplus._M_p = (pointer)*plVar7;
              }
              name._M_string_length = plVar7[1];
              *plVar7 = (long)psVar13;
              plVar7[1] = 0;
              *(undefined1 *)(plVar7 + 2) = 0;
              if (_vtx != &local_358) {
                operator_delete(_vtx,local_358 + 1);
              }
              if (_frag != &local_1a0) {
                operator_delete(_frag,local_1a0 + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)vertTemplate.m_template._M_dataplus._M_p != &vertTemplate.m_template.field_2) {
                operator_delete(vertTemplate.m_template._M_dataplus._M_p,
                                vertTemplate.m_template.field_2._M_allocated_capacity + 1);
              }
              if ((_Base_ptr *)params._M_t._M_impl._0_8_ !=
                  &params._M_t._M_impl.super__Rb_tree_header._M_header._M_parent) {
                operator_delete((void *)params._M_t._M_impl._0_8_,
                                (ulong)((long)&(params._M_t._M_impl.super__Rb_tree_header._M_header.
                                               _M_parent)->_M_color + 1));
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)fragTemplate.m_template._M_dataplus._M_p != &fragTemplate.m_template.field_2) {
                operator_delete(fragTemplate.m_template._M_dataplus._M_p,
                                fragTemplate.m_template.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)vertexShaderSource._M_dataplus._M_p != &vertexShaderSource.field_2) {
                operator_delete(vertexShaderSource._M_dataplus._M_p,
                                vertexShaderSource.field_2._M_allocated_capacity + 1);
              }
              vertexShaderSource._M_dataplus._M_p = (pointer)&vertexShaderSource.field_2;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&vertexShaderSource,"Vector subscript access with ","");
              plVar7 = (long *)std::__cxx11::string::append((char *)&vertexShaderSource);
              fragTemplate.m_template._M_dataplus._M_p = (pointer)&fragTemplate.m_template.field_2;
              psVar13 = (size_type *)(plVar7 + 2);
              if ((size_type *)*plVar7 == psVar13) {
                fragTemplate.m_template.field_2._M_allocated_capacity = *psVar13;
                fragTemplate.m_template.field_2._8_8_ = plVar7[3];
              }
              else {
                fragTemplate.m_template.field_2._M_allocated_capacity = *psVar13;
                fragTemplate.m_template._M_dataplus._M_p = (pointer)*plVar7;
              }
              fragTemplate.m_template._M_string_length = plVar7[1];
              *plVar7 = (long)psVar13;
              plVar7[1] = 0;
              *(undefined1 *)(plVar7 + 2) = 0;
              plVar7 = (long *)std::__cxx11::string::append((char *)&fragTemplate);
              params._M_t._M_impl._0_8_ =
                   &params._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
              plVar12 = plVar7 + 2;
              if ((long *)*plVar7 == plVar12) {
                params._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)*plVar12;
                params._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)plVar7[3];
              }
              else {
                params._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)*plVar12;
                params._M_t._M_impl._0_8_ = (long *)*plVar7;
              }
              params._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ = plVar7[1];
              *plVar7 = (long)plVar12;
              plVar7[1] = 0;
              *(undefined1 *)(plVar7 + 2) = 0;
              plVar7 = (long *)std::__cxx11::string::append((char *)&params);
              vertTemplate.m_template._M_dataplus._M_p = (pointer)&vertTemplate.m_template.field_2;
              psVar13 = (size_type *)(plVar7 + 2);
              if ((size_type *)*plVar7 == psVar13) {
                vertTemplate.m_template.field_2._M_allocated_capacity = *psVar13;
                vertTemplate.m_template.field_2._8_8_ = plVar7[3];
              }
              else {
                vertTemplate.m_template.field_2._M_allocated_capacity = *psVar13;
                vertTemplate.m_template._M_dataplus._M_p = (pointer)*plVar7;
              }
              vertTemplate.m_template._M_string_length = plVar7[1];
              *plVar7 = (long)psVar13;
              plVar7[1] = 0;
              *(undefined1 *)(plVar7 + 2) = 0;
              plVar7 = (long *)std::__cxx11::string::append((char *)&vertTemplate);
              _frag = &local_1a0;
              plVar12 = plVar7 + 2;
              if ((long *)*plVar7 == plVar12) {
                local_1a0 = *plVar12;
                lStack_198 = plVar7[3];
              }
              else {
                local_1a0 = *plVar12;
                _frag = (long *)*plVar7;
              }
              *plVar7 = (long)plVar12;
              plVar7[1] = 0;
              *(undefined1 *)(plVar7 + 2) = 0;
              plVar7 = (long *)std::__cxx11::string::append((char *)&frag);
              _vtx = &local_358;
              plVar12 = plVar7 + 2;
              if ((long *)*plVar7 == plVar12) {
                local_358 = *plVar12;
                lStack_350 = plVar7[3];
              }
              else {
                local_358 = *plVar12;
                _vtx = (long *)*plVar7;
              }
              *plVar7 = (long)plVar12;
              plVar7[1] = 0;
              *(undefined1 *)(plVar7 + 2) = 0;
              plVar7 = (long *)std::__cxx11::string::append((char *)&vtx);
              desc._M_dataplus._M_p = (pointer)&desc.field_2;
              psVar13 = (size_type *)(plVar7 + 2);
              if ((size_type *)*plVar7 == psVar13) {
                desc.field_2._M_allocated_capacity = *psVar13;
                desc.field_2._8_8_ = plVar7[3];
              }
              else {
                desc.field_2._M_allocated_capacity = *psVar13;
                desc._M_dataplus._M_p = (pointer)*plVar7;
              }
              desc._M_string_length = plVar7[1];
              *plVar7 = (long)psVar13;
              plVar7[1] = 0;
              *(undefined1 *)(plVar7 + 2) = 0;
              if (_vtx != &local_358) {
                operator_delete(_vtx,local_358 + 1);
              }
              if (_frag != &local_1a0) {
                operator_delete(_frag,local_1a0 + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)vertTemplate.m_template._M_dataplus._M_p != &vertTemplate.m_template.field_2) {
                operator_delete(vertTemplate.m_template._M_dataplus._M_p,
                                vertTemplate.m_template.field_2._M_allocated_capacity + 1);
              }
              if ((_Base_ptr *)params._M_t._M_impl._0_8_ !=
                  &params._M_t._M_impl.super__Rb_tree_header._M_header._M_parent) {
                operator_delete((void *)params._M_t._M_impl._0_8_,
                                (ulong)((long)&(params._M_t._M_impl.super__Rb_tree_header._M_header.
                                               _M_parent)->_M_color + 1));
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)fragTemplate.m_template._M_dataplus._M_p != &fragTemplate.m_template.field_2) {
                operator_delete(fragTemplate.m_template._M_dataplus._M_p,
                                fragTemplate.m_template.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)vertexShaderSource._M_dataplus._M_p != &vertexShaderSource.field_2) {
                operator_delete(vertexShaderSource._M_dataplus._M_p,
                                vertexShaderSource.field_2._M_allocated_capacity + 1);
              }
              pTVar2 = (this->super_TestCaseGroup).super_TestNode.m_testCtx;
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_1d0,name._M_dataplus._M_p,&local_411);
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_1f0,desc._M_dataplus._M_p,&local_412);
              std::__cxx11::ostringstream::ostringstream((ostringstream *)&vtx);
              std::__cxx11::ostringstream::ostringstream((ostringstream *)&frag);
              poVar21 = (ostringstream *)&frag;
              if (bVar17) {
                poVar21 = (ostringstream *)&vtx;
              }
              uVar3 = glu::getDataTypeMatrixNumColumns(DVar1);
              local_390 = pTVar2;
              iVar4 = glu::getDataTypeMatrixNumRows(DVar1);
              pcVar11 = getIntUniformName(uVar3);
              dataType = glu::getDataTypeFloatVec(iVar4);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&vtx,"#version 310 es\n",0x10);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&frag,"#version 310 es\n",0x10);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&vtx,"layout(location = 0) in highp vec4 a_position;\n",0x2f);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&vtx,"layout(location = 1) in highp vec4 a_coords;\n",0x2d);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&frag,"layout(location = 0) out mediump vec4 o_color;\n",0x2f);
              if (bVar17 == false) {
                lVar18 = 0x2f;
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&vtx,"layout(location = 0) out mediump vec4 v_coords;\n",0x30)
                ;
                pcVar6 = "layout(location = 0) in mediump vec4 v_coords;\n";
              }
              else {
                lVar18 = 0x2e;
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&vtx,"layout(location = 0) out mediump vec4 v_color;\n",0x2f);
                pcVar6 = "layout(location = 0) in mediump vec4 v_color;\n";
              }
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&frag,pcVar6,lVar18);
              if (((((char)local_370 != '\0') &&
                   (std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)poVar21,
                               "layout(std140, binding = 0) uniform something0 { mediump int ui_zero; };\n"
                               ,0x49), 1 < (int)uVar3)) &&
                  (std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)poVar21,
                              "layout(std140, binding = 1) uniform something1 { mediump int ui_one; };\n"
                              ,0x48), uVar3 != 2)) &&
                 (std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)poVar21,
                             "layout(std140, binding = 2) uniform something2 { mediump int ui_two; };\n"
                             ,0x48), 3 < uVar3)) {
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)poVar21,
                           "layout(std140, binding = 3) uniform something3 { mediump int ui_three; };\n"
                           ,0x4a);
              }
              if ((char)local_378 != '\0') {
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)poVar21,"layout(std140, binding = ",0x19);
                poVar9 = (ostream *)std::ostream::operator<<(poVar21,uVar3);
                std::__ostream_insert<char,std::char_traits<char>>
                          (poVar9,") uniform something",0x13);
                poVar9 = (ostream *)std::ostream::operator<<(poVar9,uVar3);
                std::__ostream_insert<char,std::char_traits<char>>(poVar9," { mediump int ",0xf);
                sVar10 = strlen(pcVar11);
                std::__ostream_insert<char,std::char_traits<char>>(poVar9,pcVar11,sVar10);
                std::__ostream_insert<char,std::char_traits<char>>(poVar9,"; };\n",5);
              }
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&vtx,"\n",1);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&vtx,"void main()\n",0xc);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&vtx,"{\n",2);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&vtx,"\tgl_Position = a_position;\n",0x1b);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&frag,"\n",1);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&frag,"void main()\n",0xc);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&frag,"{\n",2);
              pcVar6 = "\t${PRECISION} vec4 coords = v_coords;\n";
              if (bVar17 != false) {
                pcVar6 = "\t${PRECISION} vec4 coords = a_coords;\n";
              }
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar21,pcVar6,0x26);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)poVar21,"\t${PRECISION} ${MAT_TYPE} tmp;\n",0x1f);
              if (lVar15 == 0) {
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)poVar21,"\ttmp[0] = ${VEC_TYPE}(coords);\n",0x1f);
                if ((1 < (int)uVar3) &&
                   (std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)poVar21,"\ttmp[1] = ${VEC_TYPE}(coords.yzwx) * 0.5;\n",
                               0x2a), uVar3 != 2)) {
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)poVar21,"\ttmp[2] = ${VEC_TYPE}(coords.zwxy) * 0.25;\n",0x2b
                            );
                  lVar18 = 0x2c;
                  pcVar6 = "\ttmp[3] = ${VEC_TYPE}(coords.wxyz) * 0.125;\n";
LAB_0057701f:
                  if (3 < uVar3) goto LAB_005770dd;
                }
              }
              else if (lVar15 == 1) {
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)poVar21,"\ttmp[ui_zero]  = ${VEC_TYPE}(coords);\n",0x26);
                if ((1 < (int)uVar3) &&
                   (std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)poVar21,
                               "\ttmp[ui_one]   = ${VEC_TYPE}(coords.yzwx) * 0.5;\n",0x31),
                   uVar3 != 2)) {
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)poVar21,
                             "\ttmp[ui_two]   = ${VEC_TYPE}(coords.zwxy) * 0.25;\n",0x32);
                  lVar18 = 0x33;
                  pcVar6 = "\ttmp[ui_three] = ${VEC_TYPE}(coords.wxyz) * 0.125;\n";
                  goto LAB_0057701f;
                }
              }
              else {
                if (lVar15 == 2) {
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)poVar21,"\tfor (int i = 0; i < ",0x15);
                  poVar9 = (ostream *)std::ostream::operator<<(poVar21,uVar3);
                }
                else {
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)poVar21,"\tfor (int i = 0; i < ",0x15);
                  sVar10 = strlen(pcVar11);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)poVar21,pcVar11,sVar10);
                  poVar9 = (ostream *)poVar21;
                }
                std::__ostream_insert<char,std::char_traits<char>>(poVar9,"; i++)\n",7);
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar21,"\t{\n",3);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)poVar21,"\t\ttmp[i] = ${VEC_TYPE}(coords);\n",0x20);
                lVar18 = 3;
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)poVar21,"\t\tcoords = coords.yzwx * 0.5;\n",0x1e);
                pcVar6 = "\t}\n";
LAB_005770dd:
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar21,pcVar6,lVar18)
                ;
              }
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)poVar21,"\t${PRECISION} ${VEC_TYPE} res = ${VEC_TYPE}(0.0);\n",
                         0x32);
              if (lVar14 == 0) {
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)poVar21,"\tres += tmp[0];\n",0x10);
                if ((1 < (int)uVar3) &&
                   (std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)poVar21,"\tres += tmp[1];\n",0x10), uVar3 != 2)) {
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)poVar21,"\tres += tmp[2];\n",0x10);
                  lVar18 = 0x10;
                  pcVar11 = "\tres += tmp[3];\n";
LAB_005771cb:
                  if (3 < uVar3) goto LAB_00577246;
                }
              }
              else if (lVar14 == 1) {
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)poVar21,"\tres += tmp[ui_zero];\n",0x16);
                if ((1 < (int)uVar3) &&
                   (std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)poVar21,"\tres += tmp[ui_one];\n",0x15), uVar3 != 2)) {
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)poVar21,"\tres += tmp[ui_two];\n",0x15);
                  lVar18 = 0x17;
                  pcVar11 = "\tres += tmp[ui_three];\n";
                  goto LAB_005771cb;
                }
              }
              else {
                if (lVar14 == 2) {
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)poVar21,"\tfor (int i = 0; i < ",0x15);
                  poVar9 = (ostream *)std::ostream::operator<<(poVar21,uVar3);
                }
                else {
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)poVar21,"\tfor (int i = 0; i < ",0x15);
                  sVar10 = strlen(pcVar11);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)poVar21,pcVar11,sVar10);
                  poVar9 = (ostream *)poVar21;
                }
                lVar18 = 0x11;
                std::__ostream_insert<char,std::char_traits<char>>(poVar9,"; i++)\n",7);
                pcVar11 = "\t\tres += tmp[i];\n";
LAB_00577246:
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)poVar21,pcVar11,lVar18);
              }
              if (bVar17 == false) {
                lVar18 = 0x20;
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&vtx,"\tv_coords = a_coords;\n",0x16);
                pcVar11 = "\to_color = vec4(res${PADDING});\n";
              }
              else {
                lVar18 = 0x14;
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&vtx,"\tv_color = vec4(res${PADDING});\n",0x20);
                pcVar11 = "\to_color = v_color;\n";
              }
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&frag,pcVar11,lVar18);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&vtx,"}\n",2);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&frag,"}\n",2);
              params._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
                   params._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ & 0xffffffff00000000;
              params._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
              params._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
                   &params._M_t._M_impl.super__Rb_tree_header._M_header;
              params._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
              params._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
                   params._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
              fragTemplate.m_template._M_dataplus._M_p = glu::getDataTypeName(DVar1);
              std::
              pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::pair<const_char_(&)[9],_const_char_*,_true>
                        ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&vertTemplate,(char (*) [9])"MAT_TYPE",(char **)&fragTemplate);
              std::
              _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
              ::_M_emplace_unique<std::pair<std::__cxx11::string,std::__cxx11::string>>
                        ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                          *)&params,
                         (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&vertTemplate);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_4c8._M_p != &local_4b8) {
                operator_delete(local_4c8._M_p,local_4b8._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)vertTemplate.m_template._M_dataplus._M_p != &vertTemplate.m_template.field_2) {
                operator_delete(vertTemplate.m_template._M_dataplus._M_p,
                                vertTemplate.m_template.field_2._M_allocated_capacity + 1);
              }
              fragTemplate.m_template._M_dataplus._M_p = glu::getDataTypeName(dataType);
              std::
              pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::pair<const_char_(&)[9],_const_char_*,_true>
                        ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&vertTemplate,(char (*) [9])"VEC_TYPE",(char **)&fragTemplate);
              std::
              _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
              ::_M_emplace_unique<std::pair<std::__cxx11::string,std::__cxx11::string>>
                        ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                          *)&params,
                         (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&vertTemplate);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_4c8._M_p != &local_4b8) {
                operator_delete(local_4c8._M_p,local_4b8._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)vertTemplate.m_template._M_dataplus._M_p != &vertTemplate.m_template.field_2) {
                operator_delete(vertTemplate.m_template._M_dataplus._M_p,
                                vertTemplate.m_template.field_2._M_allocated_capacity + 1);
              }
              std::
              pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::pair<const_char_(&)[10],_const_char_(&)[8],_true>
                        ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&vertTemplate,(char (*) [10])0xaef277,(char (*) [8])0xb2c06a);
              std::
              _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
              ::_M_emplace_unique<std::pair<std::__cxx11::string,std::__cxx11::string>>
                        ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                          *)&params,
                         (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&vertTemplate);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_4c8._M_p != &local_4b8) {
                operator_delete(local_4c8._M_p,local_4b8._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)vertTemplate.m_template._M_dataplus._M_p != &vertTemplate.m_template.field_2) {
                operator_delete(vertTemplate.m_template._M_dataplus._M_p,
                                vertTemplate.m_template.field_2._M_allocated_capacity + 1);
              }
              if (iVar4 == 3) {
                std::
                pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::pair<const_char_(&)[8],_const_char_(&)[6],_true>
                          ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&vertTemplate,(char (*) [8])"PADDING",(char (*) [6])0xaf8ed4);
                std::
                _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                ::_M_emplace_unique<std::pair<std::__cxx11::string,std::__cxx11::string>>
                          ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                            *)&params,
                           (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&vertTemplate);
              }
              else if (iVar4 == 2) {
                std::
                pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::pair<const_char_(&)[8],_const_char_(&)[11],_true>
                          ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&vertTemplate,(char (*) [8])"PADDING",(char (*) [11])0xaf8ecf);
                std::
                _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                ::_M_emplace_unique<std::pair<std::__cxx11::string,std::__cxx11::string>>
                          ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                            *)&params,
                           (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&vertTemplate);
              }
              else {
                std::
                pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::pair<const_char_(&)[8],_const_char_(&)[1],_true>
                          ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&vertTemplate,(char (*) [8])"PADDING",(char (*) [1])0xa99b87);
                std::
                _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                ::_M_emplace_unique<std::pair<std::__cxx11::string,std::__cxx11::string>>
                          ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                            *)&params,
                           (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&vertTemplate);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_4c8._M_p != &local_4b8) {
                operator_delete(local_4c8._M_p,local_4b8._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)vertTemplate.m_template._M_dataplus._M_p != &vertTemplate.m_template.field_2) {
                operator_delete(vertTemplate.m_template._M_dataplus._M_p,
                                vertTemplate.m_template.field_2._M_allocated_capacity + 1);
              }
              std::__cxx11::stringbuf::str();
              tcu::StringTemplate::StringTemplate(&vertTemplate,&fragTemplate.m_template);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)fragTemplate.m_template._M_dataplus._M_p != &fragTemplate.m_template.field_2) {
                operator_delete(fragTemplate.m_template._M_dataplus._M_p,
                                fragTemplate.m_template.field_2._M_allocated_capacity + 1);
              }
              std::__cxx11::stringbuf::str();
              tcu::StringTemplate::StringTemplate(&fragTemplate,&vertexShaderSource);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)vertexShaderSource._M_dataplus._M_p != &vertexShaderSource.field_2) {
                operator_delete(vertexShaderSource._M_dataplus._M_p,
                                vertexShaderSource.field_2._M_allocated_capacity + 1);
              }
              tcu::StringTemplate::specialize(&vertexShaderSource,&vertTemplate,&params);
              tcu::StringTemplate::specialize(&local_3b0,&fragTemplate,&params);
              if ((uint)local_380 < 9) {
                p_Var20 = (ShaderEvalFunc)(&PTR_evalSubscriptMat2_00cf6c58)[(long)local_380];
              }
              else {
                p_Var20 = (ShaderEvalFunc)0x0;
              }
              pTVar8 = (TestNode *)operator_new(0xe0);
              ShaderIndexingCase::ShaderIndexingCase
                        ((ShaderIndexingCase *)pTVar8,local_390,&local_1d0,&local_1f0,bVar17,p_Var20
                         ,&vertexShaderSource,&local_3b0,DVar1,false);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_3b0._M_dataplus._M_p != &local_3b0.field_2) {
                operator_delete(local_3b0._M_dataplus._M_p,
                                local_3b0.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)vertexShaderSource._M_dataplus._M_p != &vertexShaderSource.field_2) {
                operator_delete(vertexShaderSource._M_dataplus._M_p,
                                vertexShaderSource.field_2._M_allocated_capacity + 1);
              }
              tcu::StringTemplate::~StringTemplate(&fragTemplate);
              tcu::StringTemplate::~StringTemplate(&vertTemplate);
              std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::~_Rb_tree(&params._M_t);
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)&frag);
              std::ios_base::~ios_base(local_140);
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)&vtx);
              std::ios_base::~ios_base(local_2f8);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
                operator_delete(local_1f0._M_dataplus._M_p,
                                local_1f0.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
                operator_delete(local_1d0._M_dataplus._M_p,
                                local_1d0.field_2._M_allocated_capacity + 1);
              }
              tcu::TestNode::addChild(pTVar5,pTVar8);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)desc._M_dataplus._M_p != &desc.field_2) {
                operator_delete(desc._M_dataplus._M_p,desc.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)name._M_dataplus._M_p != &name.field_2) {
                operator_delete(name._M_dataplus._M_p,name.field_2._M_allocated_capacity + 1);
              }
              lVar18 = 1;
              bVar22 = bVar17 != false;
              bVar17 = false;
            } while (bVar22);
            lVar14 = lVar14 + 1;
          } while (lVar14 != 4);
          lVar15 = lVar15 + 1;
        } while (lVar15 != 4);
        local_388 = local_388 + 1;
        if (local_388 == 9) {
          tcu::TestNode::addChild((TestNode *)this,pTVar5);
          return extraout_EAX;
        }
      } while( true );
    }
  } while( true );
}

Assistant:

void ShaderIndexingTests::init (void)
{
	static const ShaderType s_shaderTypes[] =
	{
		SHADERTYPE_VERTEX,
		SHADERTYPE_FRAGMENT
	};

	static const DataType s_floatAndVecTypes[] =
	{
		TYPE_FLOAT,
		TYPE_FLOAT_VEC2,
		TYPE_FLOAT_VEC3,
		TYPE_FLOAT_VEC4
	};

	// Varying array access cases.
	{
		de::MovePtr<TestCaseGroup> varyingGroup(new TestCaseGroup(m_testCtx, "varying_array", "Varying array access tests."));

		for (int typeNdx = 0; typeNdx < DE_LENGTH_OF_ARRAY(s_floatAndVecTypes); typeNdx++)
		{
			DataType varType = s_floatAndVecTypes[typeNdx];
			for (int vertAccess = 0; vertAccess < INDEXACCESS_LAST; vertAccess++)
			{
				for (int fragAccess = 0; fragAccess < INDEXACCESS_LAST; fragAccess++)
				{
					const char* vertAccessName = getIndexAccessTypeName((IndexAccessType)vertAccess);
					const char* fragAccessName = getIndexAccessTypeName((IndexAccessType)fragAccess);
					string name = string(getDataTypeName(varType)) + "_" + vertAccessName + "_write_" + fragAccessName + "_read";
					string desc = string("Varying array with ") + vertAccessName + " write in vertex shader and " + fragAccessName + " read in fragment shader.";
					de::MovePtr<ShaderIndexingCase> testCase(createVaryingArrayCase(m_testCtx, name, desc, varType, (IndexAccessType)vertAccess, (IndexAccessType)fragAccess));
					varyingGroup->addChild(testCase.release());
				}
			}
		}

		addChild(varyingGroup.release());
	}

	// Uniform array access cases.
	{
		de::MovePtr<TestCaseGroup> uniformGroup(new TestCaseGroup(m_testCtx, "uniform_array", "Uniform array access tests."));

		for (int typeNdx = 0; typeNdx < DE_LENGTH_OF_ARRAY(s_floatAndVecTypes); typeNdx++)
		{
			DataType varType = s_floatAndVecTypes[typeNdx];
			for (int readAccess = 0; readAccess < INDEXACCESS_LAST; readAccess++)
			{
				const char* readAccessName = getIndexAccessTypeName((IndexAccessType)readAccess);
				for (int shaderTypeNdx = 0; shaderTypeNdx < DE_LENGTH_OF_ARRAY(s_shaderTypes); shaderTypeNdx++)
				{
					ShaderType	shaderType		= s_shaderTypes[shaderTypeNdx];
					const char*	shaderTypeName	= getShaderTypeName(shaderType);
					string		name			= string(getDataTypeName(varType)) + "_" + readAccessName + "_read_" + shaderTypeName;
					string		desc			= string("Uniform array with ") + readAccessName + " read in " + shaderTypeName + " shader.";
					bool isVertexCase = ((ShaderType)shaderType == SHADERTYPE_VERTEX);
					de::MovePtr<ShaderIndexingCase> testCase(createUniformArrayCase(m_testCtx, name, desc, isVertexCase, varType, (IndexAccessType)readAccess));
					uniformGroup->addChild(testCase.release());
				}
			}
		}

		addChild(uniformGroup.release());
	}

	// Temporary array access cases.
	{
		de::MovePtr<TestCaseGroup> tmpGroup(new TestCaseGroup(m_testCtx, "tmp_array", "Temporary array access tests."));

		for (int typeNdx = 0; typeNdx < DE_LENGTH_OF_ARRAY(s_floatAndVecTypes); typeNdx++)
		{
			DataType varType = s_floatAndVecTypes[typeNdx];
			for (int writeAccess = 0; writeAccess < INDEXACCESS_LAST; writeAccess++)
			{
				for (int readAccess = 0; readAccess < INDEXACCESS_LAST; readAccess++)
				{
					const char* writeAccessName = getIndexAccessTypeName((IndexAccessType)writeAccess);
					const char* readAccessName = getIndexAccessTypeName((IndexAccessType)readAccess);

					for (int shaderTypeNdx = 0; shaderTypeNdx < DE_LENGTH_OF_ARRAY(s_shaderTypes); shaderTypeNdx++)
					{
						ShaderType	shaderType		= s_shaderTypes[shaderTypeNdx];
						const char* shaderTypeName	= getShaderTypeName(shaderType);
						string		name			= string(getDataTypeName(varType)) + "_" + writeAccessName + "_write_" + readAccessName + "_read_" + shaderTypeName;
						string		desc			= string("Temporary array with ") + writeAccessName + " write and " + readAccessName + " read in " + shaderTypeName + " shader.";
						bool		isVertexCase	= ((ShaderType)shaderType == SHADERTYPE_VERTEX);
						de::MovePtr<ShaderIndexingCase> testCase(createTmpArrayCase(m_testCtx, name, desc, isVertexCase, varType, (IndexAccessType)writeAccess, (IndexAccessType)readAccess));
						tmpGroup->addChild(testCase.release());
					}
				}
			}
		}

		addChild(tmpGroup.release());
	}

	// Vector indexing with subscripts.
	{
		de::MovePtr<TestCaseGroup> vecGroup(new TestCaseGroup(m_testCtx, "vector_subscript", "Vector subscript indexing."));

		static const DataType s_vectorTypes[] =
		{
			TYPE_FLOAT_VEC2,
			TYPE_FLOAT_VEC3,
			TYPE_FLOAT_VEC4
		};

		for (int typeNdx = 0; typeNdx < DE_LENGTH_OF_ARRAY(s_vectorTypes); typeNdx++)
		{
			DataType varType = s_vectorTypes[typeNdx];
			for (int writeAccess = 0; writeAccess < VECTORACCESS_LAST; writeAccess++)
			{
				for (int readAccess = 0; readAccess < VECTORACCESS_LAST; readAccess++)
				{
					const char* writeAccessName = getVectorAccessTypeName((VectorAccessType)writeAccess);
					const char* readAccessName = getVectorAccessTypeName((VectorAccessType)readAccess);

					for (int shaderTypeNdx = 0; shaderTypeNdx < DE_LENGTH_OF_ARRAY(s_shaderTypes); shaderTypeNdx++)
					{
						ShaderType	shaderType		= s_shaderTypes[shaderTypeNdx];
						const char* shaderTypeName	= getShaderTypeName(shaderType);
						string		name			= string(getDataTypeName(varType)) + "_" + writeAccessName + "_write_" + readAccessName + "_read_" + shaderTypeName;
						string		desc			= string("Vector subscript access with ") + writeAccessName + " write and " + readAccessName + " read in " + shaderTypeName + " shader.";
						bool		isVertexCase	= ((ShaderType)shaderType == SHADERTYPE_VERTEX);
						de::MovePtr<ShaderIndexingCase> testCase(createVectorSubscriptCase(m_testCtx, name.c_str(), desc.c_str(), isVertexCase, varType, (VectorAccessType)writeAccess, (VectorAccessType)readAccess));
						vecGroup->addChild(testCase.release());
					}
				}
			}
		}

		addChild(vecGroup.release());
	}

	// Matrix indexing with subscripts.
	{
		de::MovePtr<TestCaseGroup> matGroup(new TestCaseGroup(m_testCtx, "matrix_subscript", "Matrix subscript indexing."));

		static const DataType s_matrixTypes[] =
		{
			TYPE_FLOAT_MAT2,
			TYPE_FLOAT_MAT2X3,
			TYPE_FLOAT_MAT2X4,
			TYPE_FLOAT_MAT3X2,
			TYPE_FLOAT_MAT3,
			TYPE_FLOAT_MAT3X4,
			TYPE_FLOAT_MAT4X2,
			TYPE_FLOAT_MAT4X3,
			TYPE_FLOAT_MAT4
		};

		for (int typeNdx = 0; typeNdx < DE_LENGTH_OF_ARRAY(s_matrixTypes); typeNdx++)
		{
			DataType varType = s_matrixTypes[typeNdx];
			for (int writeAccess = 0; writeAccess < INDEXACCESS_LAST; writeAccess++)
			{
				for (int readAccess = 0; readAccess < INDEXACCESS_LAST; readAccess++)
				{
					const char* writeAccessName = getIndexAccessTypeName((IndexAccessType)writeAccess);
					const char* readAccessName = getIndexAccessTypeName((IndexAccessType)readAccess);

					for (int shaderTypeNdx = 0; shaderTypeNdx < DE_LENGTH_OF_ARRAY(s_shaderTypes); shaderTypeNdx++)
					{
						ShaderType	shaderType		= s_shaderTypes[shaderTypeNdx];
						const char* shaderTypeName	= getShaderTypeName(shaderType);
						string		name			= string(getDataTypeName(varType)) + "_" + writeAccessName + "_write_" + readAccessName + "_read_" + shaderTypeName;
						string		desc			= string("Vector subscript access with ") + writeAccessName + " write and " + readAccessName + " read in " + shaderTypeName + " shader.";
						bool		isVertexCase	= ((ShaderType)shaderType == SHADERTYPE_VERTEX);
						de::MovePtr<ShaderIndexingCase> testCase(createMatrixSubscriptCase(m_testCtx, name.c_str(), desc.c_str(), isVertexCase, varType, (IndexAccessType)writeAccess, (IndexAccessType)readAccess));
						matGroup->addChild(testCase.release());
					}
				}
			}
		}

		addChild(matGroup.release());
	}
}